

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [60];
  undefined1 auVar65 [60];
  undefined1 auVar66 [12];
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  ulong uVar92;
  uint uVar93;
  byte bVar94;
  byte bVar95;
  ulong uVar96;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar97;
  long lVar98;
  bool bVar99;
  ulong uVar100;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  uint uVar168;
  uint uVar169;
  uint uVar170;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  uint uVar171;
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  float pp;
  float fVar172;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar192 [32];
  float fVar196;
  undefined1 auVar193 [64];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar197;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  float fVar236;
  float fVar237;
  undefined4 uVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [16];
  float fVar258;
  float fVar260;
  undefined1 auVar254 [16];
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar261;
  float fVar262;
  undefined1 auVar255 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  float fVar266;
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  undefined1 local_bc0 [16];
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [16];
  undefined1 (*local_ac8) [32];
  Primitive *local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  float afStack_160 [2];
  uint auStack_158 [74];
  undefined1 auVar160 [64];
  undefined1 auVar164 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  PVar2 = prim[1];
  uVar92 = (ulong)(byte)PVar2;
  fVar237 = *(float *)(prim + uVar92 * 0x19 + 0x12);
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar108 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar109 = vsubps_avx(auVar103,*(undefined1 (*) [16])(prim + uVar92 * 0x19 + 6));
  fVar236 = fVar237 * auVar109._0_4_;
  fVar172 = fVar237 * auVar108._0_4_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar92 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar103);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar92 * 5 + 6);
  auVar115 = vpmovsxbd_avx2(auVar21);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar92 * 6 + 6);
  auVar118 = vpmovsxbd_avx2(auVar104);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar92 * 0xb + 6);
  auVar119 = vpmovsxbd_avx2(auVar105);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar124 = vpmovsxbd_avx2(auVar101);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar120 = vcvtdq2ps_avx(auVar124);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar92 + 6);
  auVar116 = vpmovsxbd_avx2(auVar106);
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar100 = (ulong)(uint)((int)(uVar92 * 9) * 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar100 + 6);
  auVar121 = vpmovsxbd_avx2(auVar1);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar100 + uVar92 + 6);
  auVar122 = vpmovsxbd_avx2(auVar102);
  auVar122 = vcvtdq2ps_avx(auVar122);
  uVar96 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar96 + 6);
  auVar114 = vpmovsxbd_avx2(auVar107);
  auVar123 = vcvtdq2ps_avx(auVar114);
  auVar134._4_4_ = fVar172;
  auVar134._0_4_ = fVar172;
  auVar134._8_4_ = fVar172;
  auVar134._12_4_ = fVar172;
  auVar134._16_4_ = fVar172;
  auVar134._20_4_ = fVar172;
  auVar134._24_4_ = fVar172;
  auVar134._28_4_ = fVar172;
  auVar136._8_4_ = 1;
  auVar136._0_8_ = 0x100000001;
  auVar136._12_4_ = 1;
  auVar136._16_4_ = 1;
  auVar136._20_4_ = 1;
  auVar136._24_4_ = 1;
  auVar136._28_4_ = 1;
  auVar112 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar126 = ZEXT1632(CONCAT412(fVar237 * auVar108._12_4_,
                                CONCAT48(fVar237 * auVar108._8_4_,
                                         CONCAT44(fVar237 * auVar108._4_4_,fVar172))));
  auVar125 = vpermps_avx2(auVar136,auVar126);
  auVar113 = vpermps_avx512vl(auVar112,auVar126);
  fVar172 = auVar113._0_4_;
  fVar256 = auVar113._4_4_;
  auVar126._4_4_ = fVar256 * auVar118._4_4_;
  auVar126._0_4_ = fVar172 * auVar118._0_4_;
  fVar257 = auVar113._8_4_;
  auVar126._8_4_ = fVar257 * auVar118._8_4_;
  fVar259 = auVar113._12_4_;
  auVar126._12_4_ = fVar259 * auVar118._12_4_;
  fVar266 = auVar113._16_4_;
  auVar126._16_4_ = fVar266 * auVar118._16_4_;
  fVar196 = auVar113._20_4_;
  auVar126._20_4_ = fVar196 * auVar118._20_4_;
  fVar261 = auVar113._24_4_;
  auVar126._24_4_ = fVar261 * auVar118._24_4_;
  auVar126._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar116._4_4_ * fVar256;
  auVar124._0_4_ = auVar116._0_4_ * fVar172;
  auVar124._8_4_ = auVar116._8_4_ * fVar257;
  auVar124._12_4_ = auVar116._12_4_ * fVar259;
  auVar124._16_4_ = auVar116._16_4_ * fVar266;
  auVar124._20_4_ = auVar116._20_4_ * fVar196;
  auVar124._24_4_ = auVar116._24_4_ * fVar261;
  auVar124._28_4_ = auVar114._28_4_;
  auVar114._4_4_ = auVar123._4_4_ * fVar256;
  auVar114._0_4_ = auVar123._0_4_ * fVar172;
  auVar114._8_4_ = auVar123._8_4_ * fVar257;
  auVar114._12_4_ = auVar123._12_4_ * fVar259;
  auVar114._16_4_ = auVar123._16_4_ * fVar266;
  auVar114._20_4_ = auVar123._20_4_ * fVar196;
  auVar114._24_4_ = auVar123._24_4_ * fVar261;
  auVar114._28_4_ = auVar113._28_4_;
  auVar103 = vfmadd231ps_fma(auVar126,auVar125,auVar115);
  auVar21 = vfmadd231ps_fma(auVar124,auVar125,auVar120);
  auVar104 = vfmadd231ps_fma(auVar114,auVar122,auVar125);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar134,auVar117);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar134,auVar119);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar121,auVar134);
  auVar135._4_4_ = fVar236;
  auVar135._0_4_ = fVar236;
  auVar135._8_4_ = fVar236;
  auVar135._12_4_ = fVar236;
  auVar135._16_4_ = fVar236;
  auVar135._20_4_ = fVar236;
  auVar135._24_4_ = fVar236;
  auVar135._28_4_ = fVar236;
  auVar114 = ZEXT1632(CONCAT412(fVar237 * auVar109._12_4_,
                                CONCAT48(fVar237 * auVar109._8_4_,
                                         CONCAT44(fVar237 * auVar109._4_4_,fVar236))));
  auVar124 = vpermps_avx2(auVar136,auVar114);
  auVar114 = vpermps_avx512vl(auVar112,auVar114);
  fVar237 = auVar114._0_4_;
  fVar172 = auVar114._4_4_;
  auVar125._4_4_ = fVar172 * auVar118._4_4_;
  auVar125._0_4_ = fVar237 * auVar118._0_4_;
  fVar256 = auVar114._8_4_;
  auVar125._8_4_ = fVar256 * auVar118._8_4_;
  fVar257 = auVar114._12_4_;
  auVar125._12_4_ = fVar257 * auVar118._12_4_;
  fVar259 = auVar114._16_4_;
  auVar125._16_4_ = fVar259 * auVar118._16_4_;
  fVar266 = auVar114._20_4_;
  auVar125._20_4_ = fVar266 * auVar118._20_4_;
  fVar196 = auVar114._24_4_;
  auVar125._24_4_ = fVar196 * auVar118._24_4_;
  auVar125._28_4_ = 1;
  auVar112._4_4_ = auVar116._4_4_ * fVar172;
  auVar112._0_4_ = auVar116._0_4_ * fVar237;
  auVar112._8_4_ = auVar116._8_4_ * fVar256;
  auVar112._12_4_ = auVar116._12_4_ * fVar257;
  auVar112._16_4_ = auVar116._16_4_ * fVar259;
  auVar112._20_4_ = auVar116._20_4_ * fVar266;
  auVar112._24_4_ = auVar116._24_4_ * fVar196;
  auVar112._28_4_ = auVar118._28_4_;
  auVar116._4_4_ = auVar123._4_4_ * fVar172;
  auVar116._0_4_ = auVar123._0_4_ * fVar237;
  auVar116._8_4_ = auVar123._8_4_ * fVar256;
  auVar116._12_4_ = auVar123._12_4_ * fVar257;
  auVar116._16_4_ = auVar123._16_4_ * fVar259;
  auVar116._20_4_ = auVar123._20_4_ * fVar266;
  auVar116._24_4_ = auVar123._24_4_ * fVar196;
  auVar116._28_4_ = auVar114._28_4_;
  auVar105 = vfmadd231ps_fma(auVar125,auVar124,auVar115);
  auVar101 = vfmadd231ps_fma(auVar112,auVar124,auVar120);
  auVar106 = vfmadd231ps_fma(auVar116,auVar124,auVar122);
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar135,auVar117);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar135,auVar119);
  auVar131._8_4_ = 0x7fffffff;
  auVar131._0_8_ = 0x7fffffff7fffffff;
  auVar131._12_4_ = 0x7fffffff;
  auVar131._16_4_ = 0x7fffffff;
  auVar131._20_4_ = 0x7fffffff;
  auVar131._24_4_ = 0x7fffffff;
  auVar131._28_4_ = 0x7fffffff;
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar135,auVar121);
  auVar117 = vandps_avx(ZEXT1632(auVar103),auVar131);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar133._16_4_ = 0x219392ef;
  auVar133._20_4_ = 0x219392ef;
  auVar133._24_4_ = 0x219392ef;
  auVar133._28_4_ = 0x219392ef;
  uVar100 = vcmpps_avx512vl(auVar117,auVar133,1);
  bVar7 = (bool)((byte)uVar100 & 1);
  auVar113._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar103._0_4_;
  bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar103._4_4_;
  bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar103._8_4_;
  bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar103._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar100 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar21),auVar131);
  uVar100 = vcmpps_avx512vl(auVar117,auVar133,1);
  bVar7 = (bool)((byte)uVar100 & 1);
  auVar127._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._0_4_;
  bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
  auVar127._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._4_4_;
  bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
  auVar127._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._8_4_;
  bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
  auVar127._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._12_4_;
  auVar127._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * 0x219392ef;
  auVar127._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * 0x219392ef;
  auVar127._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * 0x219392ef;
  auVar127._28_4_ = (uint)(byte)(uVar100 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar104),auVar131);
  uVar100 = vcmpps_avx512vl(auVar117,auVar133,1);
  bVar7 = (bool)((byte)uVar100 & 1);
  auVar117._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._0_4_;
  bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._4_4_;
  bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._8_4_;
  bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar104._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar100 >> 7) * 0x219392ef;
  auVar115 = vrcp14ps_avx512vl(auVar113);
  auVar132._8_4_ = 0x3f800000;
  auVar132._0_8_ = &DAT_3f8000003f800000;
  auVar132._12_4_ = 0x3f800000;
  auVar132._16_4_ = 0x3f800000;
  auVar132._20_4_ = 0x3f800000;
  auVar132._24_4_ = 0x3f800000;
  auVar132._28_4_ = 0x3f800000;
  auVar103 = vfnmadd213ps_fma(auVar113,auVar115,auVar132);
  auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar115,auVar115);
  auVar115 = vrcp14ps_avx512vl(auVar127);
  auVar21 = vfnmadd213ps_fma(auVar127,auVar115,auVar132);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar115,auVar115);
  auVar115 = vrcp14ps_avx512vl(auVar117);
  auVar104 = vfnmadd213ps_fma(auVar117,auVar115,auVar132);
  auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar115,auVar115);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar105));
  auVar121._4_4_ = auVar103._4_4_ * auVar117._4_4_;
  auVar121._0_4_ = auVar103._0_4_ * auVar117._0_4_;
  auVar121._8_4_ = auVar103._8_4_ * auVar117._8_4_;
  auVar121._12_4_ = auVar103._12_4_ * auVar117._12_4_;
  auVar121._16_4_ = auVar117._16_4_ * 0.0;
  auVar121._20_4_ = auVar117._20_4_ * 0.0;
  auVar121._24_4_ = auVar117._24_4_ * 0.0;
  auVar121._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar105));
  auVar116 = vpbroadcastd_avx512vl();
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar130._0_4_ = auVar103._0_4_ * auVar117._0_4_;
  auVar130._4_4_ = auVar103._4_4_ * auVar117._4_4_;
  auVar130._8_4_ = auVar103._8_4_ * auVar117._8_4_;
  auVar130._12_4_ = auVar103._12_4_ * auVar117._12_4_;
  auVar130._16_4_ = auVar117._16_4_ * 0.0;
  auVar130._20_4_ = auVar117._20_4_ * 0.0;
  auVar130._24_4_ = auVar117._24_4_ * 0.0;
  auVar130._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar92 * -2 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar101));
  auVar122._4_4_ = auVar21._4_4_ * auVar117._4_4_;
  auVar122._0_4_ = auVar21._0_4_ * auVar117._0_4_;
  auVar122._8_4_ = auVar21._8_4_ * auVar117._8_4_;
  auVar122._12_4_ = auVar21._12_4_ * auVar117._12_4_;
  auVar122._16_4_ = auVar117._16_4_ * 0.0;
  auVar122._20_4_ = auVar117._20_4_ * 0.0;
  auVar122._24_4_ = auVar117._24_4_ * 0.0;
  auVar122._28_4_ = auVar117._28_4_;
  auVar117 = vcvtdq2ps_avx(auVar115);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar101));
  auVar129._0_4_ = auVar21._0_4_ * auVar117._0_4_;
  auVar129._4_4_ = auVar21._4_4_ * auVar117._4_4_;
  auVar129._8_4_ = auVar21._8_4_ * auVar117._8_4_;
  auVar129._12_4_ = auVar21._12_4_ * auVar117._12_4_;
  auVar129._16_4_ = auVar117._16_4_ * 0.0;
  auVar129._20_4_ = auVar117._20_4_ * 0.0;
  auVar129._24_4_ = auVar117._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 + uVar92 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar106));
  auVar123._4_4_ = auVar117._4_4_ * auVar104._4_4_;
  auVar123._0_4_ = auVar117._0_4_ * auVar104._0_4_;
  auVar123._8_4_ = auVar117._8_4_ * auVar104._8_4_;
  auVar123._12_4_ = auVar117._12_4_ * auVar104._12_4_;
  auVar123._16_4_ = auVar117._16_4_ * 0.0;
  auVar123._20_4_ = auVar117._20_4_ * 0.0;
  auVar123._24_4_ = auVar117._24_4_ * 0.0;
  auVar123._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar106));
  auVar128._0_4_ = auVar104._0_4_ * auVar117._0_4_;
  auVar128._4_4_ = auVar104._4_4_ * auVar117._4_4_;
  auVar128._8_4_ = auVar104._8_4_ * auVar117._8_4_;
  auVar128._12_4_ = auVar104._12_4_ * auVar117._12_4_;
  auVar128._16_4_ = auVar117._16_4_ * 0.0;
  auVar128._20_4_ = auVar117._20_4_ * 0.0;
  auVar128._24_4_ = auVar117._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar117 = vpminsd_avx2(auVar121,auVar130);
  auVar115 = vpminsd_avx2(auVar122,auVar129);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115 = vpminsd_avx2(auVar123,auVar128);
  uVar238 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar118._4_4_ = uVar238;
  auVar118._0_4_ = uVar238;
  auVar118._8_4_ = uVar238;
  auVar118._12_4_ = uVar238;
  auVar118._16_4_ = uVar238;
  auVar118._20_4_ = uVar238;
  auVar118._24_4_ = uVar238;
  auVar118._28_4_ = uVar238;
  auVar115 = vmaxps_avx512vl(auVar115,auVar118);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115._8_4_ = 0x3f7ffffa;
  auVar115._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar115._12_4_ = 0x3f7ffffa;
  auVar115._16_4_ = 0x3f7ffffa;
  auVar115._20_4_ = 0x3f7ffffa;
  auVar115._24_4_ = 0x3f7ffffa;
  auVar115._28_4_ = 0x3f7ffffa;
  local_760 = vmulps_avx512vl(auVar117,auVar115);
  auVar117 = vpmaxsd_avx2(auVar121,auVar130);
  auVar115 = vpmaxsd_avx2(auVar122,auVar129);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar115 = vpmaxsd_avx2(auVar123,auVar128);
  uVar238 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar119._4_4_ = uVar238;
  auVar119._0_4_ = uVar238;
  auVar119._8_4_ = uVar238;
  auVar119._12_4_ = uVar238;
  auVar119._16_4_ = uVar238;
  auVar119._20_4_ = uVar238;
  auVar119._24_4_ = uVar238;
  auVar119._28_4_ = uVar238;
  auVar115 = vminps_avx512vl(auVar115,auVar119);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar120._8_4_ = 0x3f800003;
  auVar120._0_8_ = 0x3f8000033f800003;
  auVar120._12_4_ = 0x3f800003;
  auVar120._16_4_ = 0x3f800003;
  auVar120._20_4_ = 0x3f800003;
  auVar120._24_4_ = 0x3f800003;
  auVar120._28_4_ = 0x3f800003;
  auVar117 = vmulps_avx512vl(auVar117,auVar120);
  uVar25 = vpcmpgtd_avx512vl(auVar116,_DAT_0205a920);
  uVar23 = vcmpps_avx512vl(local_760,auVar117,2);
  if ((byte)((byte)uVar23 & (byte)uVar25) == 0) {
    return;
  }
  local_aa8 = (ulong)(byte)((byte)uVar23 & (byte)uVar25);
  local_ac8 = (undefined1 (*) [32])local_240;
  auVar193 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar193);
  local_ac0 = prim;
LAB_01dece0d:
  lVar98 = 0;
  for (uVar100 = local_aa8; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
    lVar98 = lVar98 + 1;
  }
  uVar97 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar98 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar97].ptr;
  uVar100 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                            pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)uVar3);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar98 = *(long *)&pGVar4[1].time_range.upper;
  auVar103 = *(undefined1 (*) [16])(lVar98 + (long)p_Var5 * uVar100);
  auVar21 = *(undefined1 (*) [16])(lVar98 + (uVar100 + 1) * (long)p_Var5);
  auVar104 = *(undefined1 (*) [16])(lVar98 + (uVar100 + 2) * (long)p_Var5);
  local_aa8 = local_aa8 - 1 & local_aa8;
  auVar105 = *(undefined1 (*) [16])(lVar98 + (uVar100 + 3) * (long)p_Var5);
  if (local_aa8 != 0) {
    uVar96 = local_aa8 - 1 & local_aa8;
    for (uVar100 = local_aa8; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
    }
    if (uVar96 != 0) {
      for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar106 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar117 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar157._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar101 = vunpcklps_avx512vl(auVar117._0_16_,auVar157._0_16_);
  auVar193._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar272 = ZEXT3264(auVar193._0_32_);
  auVar107 = auVar193._0_16_;
  local_a20 = vinsertps_avx512f(auVar101,auVar107,0x28);
  auVar109._0_4_ = auVar103._0_4_ + auVar21._0_4_ + auVar104._0_4_ + auVar105._0_4_;
  auVar109._4_4_ = auVar103._4_4_ + auVar21._4_4_ + auVar104._4_4_ + auVar105._4_4_;
  auVar109._8_4_ = auVar103._8_4_ + auVar21._8_4_ + auVar104._8_4_ + auVar105._8_4_;
  auVar109._12_4_ = auVar103._12_4_ + auVar21._12_4_ + auVar104._12_4_ + auVar105._12_4_;
  auVar108._8_4_ = 0x3e800000;
  auVar108._0_8_ = 0x3e8000003e800000;
  auVar108._12_4_ = 0x3e800000;
  auVar101 = vmulps_avx512vl(auVar109,auVar108);
  auVar101 = vsubps_avx(auVar101,auVar106);
  auVar101 = vdpps_avx(auVar101,local_a20,0x7f);
  fVar237 = *(float *)(ray + k * 4 + 0xc0);
  local_a30 = vdpps_avx(local_a20,local_a20,0x7f);
  auVar111._4_12_ = ZEXT812(0) << 0x20;
  auVar111._0_4_ = local_a30._0_4_;
  auVar102 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar111);
  auVar1 = vfnmadd213ss_fma(auVar102,local_a30,ZEXT416(0x40000000));
  local_740 = auVar101._0_4_ * auVar102._0_4_ * auVar1._0_4_;
  auVar110._4_4_ = local_740;
  auVar110._0_4_ = local_740;
  auVar110._8_4_ = local_740;
  auVar110._12_4_ = local_740;
  fStack_8f0 = local_740;
  _local_900 = auVar110;
  fStack_8ec = local_740;
  fStack_8e8 = local_740;
  fStack_8e4 = local_740;
  auVar101 = vfmadd231ps_fma(auVar106,local_a20,auVar110);
  auVar101 = vblendps_avx(auVar101,ZEXT816(0) << 0x40,8);
  auVar103 = vsubps_avx(auVar103,auVar101);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar21 = vsubps_avx(auVar21,auVar101);
  auVar105 = vsubps_avx(auVar105,auVar101);
  local_520 = auVar103._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  auVar138._8_4_ = 1;
  auVar138._0_8_ = 0x100000001;
  auVar138._12_4_ = 1;
  auVar138._16_4_ = 1;
  auVar138._20_4_ = 1;
  auVar138._24_4_ = 1;
  auVar138._28_4_ = 1;
  local_940 = ZEXT1632(auVar103);
  local_540 = vpermps_avx2(auVar138,local_940);
  auVar139._8_4_ = 2;
  auVar139._0_8_ = 0x200000002;
  auVar139._12_4_ = 2;
  auVar139._16_4_ = 2;
  auVar139._20_4_ = 2;
  auVar139._24_4_ = 2;
  auVar139._28_4_ = 2;
  local_560 = vpermps_avx2(auVar139,local_940);
  auVar142._8_4_ = 3;
  auVar142._0_8_ = 0x300000003;
  auVar142._12_4_ = 3;
  auVar142._16_4_ = 3;
  auVar142._20_4_ = 3;
  auVar142._24_4_ = 3;
  auVar142._28_4_ = 3;
  local_580 = vpermps_avx2(auVar142,local_940);
  local_5a0 = auVar21._0_4_;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_980 = ZEXT1632(auVar21);
  local_5c0 = vpermps_avx2(auVar138,local_980);
  local_5e0 = vpermps_avx2(auVar139,local_980);
  local_600 = vpermps_avx2(auVar142,local_980);
  local_620 = auVar104._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_960 = ZEXT1632(auVar104);
  local_640 = vpermps_avx2(auVar138,local_960);
  local_660 = vpermps_avx2(auVar139,local_960);
  local_680 = vpermps_avx2(auVar142,local_960);
  uVar238 = auVar105._0_4_;
  local_6a0._4_4_ = uVar238;
  local_6a0._0_4_ = uVar238;
  fStack_698 = (float)uVar238;
  fStack_694 = (float)uVar238;
  fStack_690 = (float)uVar238;
  fStack_68c = (float)uVar238;
  fStack_688 = (float)uVar238;
  register0x0000131c = uVar238;
  auVar249 = ZEXT3264(_local_6a0);
  _local_9a0 = ZEXT1632(auVar105);
  _local_6c0 = vpermps_avx2(auVar138,_local_9a0);
  _local_6e0 = vpermps_avx2(auVar139,_local_9a0);
  _local_700 = vpermps_avx2(auVar142,_local_9a0);
  auVar103 = vmulss_avx512f(auVar107,auVar107);
  auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar157._0_32_,auVar157._0_32_);
  local_7e0 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar117);
  local_720._0_4_ = local_7e0._0_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  auVar137._8_4_ = 0x7fffffff;
  auVar137._0_8_ = 0x7fffffff7fffffff;
  auVar137._12_4_ = 0x7fffffff;
  auVar137._16_4_ = 0x7fffffff;
  auVar137._20_4_ = 0x7fffffff;
  auVar137._24_4_ = 0x7fffffff;
  auVar137._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_720,auVar137);
  local_a00 = ZEXT416((uint)local_740);
  local_740 = fVar237 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar156 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar156);
  local_ab8 = 1;
  local_ab0 = 0;
  auVar156 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar156);
  auVar103 = vsqrtss_avx(local_a30,local_a30);
  auVar21 = vsqrtss_avx(local_a30,local_a30);
  auVar235 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar242 = ZEXT3264(_DAT_02020f20);
  auVar193._32_32_ = auVar156._32_32_;
  local_aa0 = auVar193._0_32_;
  do {
    local_ae0 = auVar235._0_16_;
    auVar104 = vmovshdup_avx(local_ae0);
    fVar172 = auVar235._0_4_;
    fVar196 = auVar104._0_4_ - fVar172;
    fVar266 = fVar196 * 0.04761905;
    auVar252._4_4_ = fVar172;
    auVar252._0_4_ = fVar172;
    auVar252._8_4_ = fVar172;
    auVar252._12_4_ = fVar172;
    auVar252._16_4_ = fVar172;
    auVar252._20_4_ = fVar172;
    auVar252._24_4_ = fVar172;
    auVar252._28_4_ = fVar172;
    local_a60._4_4_ = fVar196;
    local_a60._0_4_ = fVar196;
    local_a60._8_4_ = fVar196;
    local_a60._12_4_ = fVar196;
    local_a60._16_4_ = fVar196;
    local_a60._20_4_ = fVar196;
    local_a60._24_4_ = fVar196;
    local_a60._28_4_ = fVar196;
    auVar104 = vfmadd231ps_fma(auVar252,local_a60,auVar242._0_32_);
    auVar181._8_4_ = 0x3f800000;
    auVar181._0_8_ = &DAT_3f8000003f800000;
    auVar181._12_4_ = 0x3f800000;
    auVar181._16_4_ = 0x3f800000;
    auVar181._20_4_ = 0x3f800000;
    auVar181._24_4_ = 0x3f800000;
    auVar181._28_4_ = 0x3f800000;
    auVar115 = vsubps_avx(auVar181,ZEXT1632(auVar104));
    auVar86._4_4_ = fStack_59c;
    auVar86._0_4_ = local_5a0;
    auVar86._8_4_ = fStack_598;
    auVar86._12_4_ = fStack_594;
    auVar86._16_4_ = fStack_590;
    auVar86._20_4_ = fStack_58c;
    auVar86._24_4_ = fStack_588;
    auVar86._28_4_ = fStack_584;
    fVar172 = auVar104._0_4_;
    auVar210._0_4_ = local_5a0 * fVar172;
    fVar256 = auVar104._4_4_;
    auVar210._4_4_ = fStack_59c * fVar256;
    fVar257 = auVar104._8_4_;
    auVar210._8_4_ = fStack_598 * fVar257;
    fVar259 = auVar104._12_4_;
    auVar210._12_4_ = fStack_594 * fVar259;
    auVar210._16_4_ = fStack_590 * 0.0;
    auVar210._20_4_ = fStack_58c * 0.0;
    auVar210._24_4_ = fStack_588 * 0.0;
    auVar210._28_4_ = 0;
    auVar156._0_4_ = local_5c0._0_4_ * fVar172;
    auVar156._4_4_ = local_5c0._4_4_ * fVar256;
    auVar156._8_4_ = local_5c0._8_4_ * fVar257;
    auVar156._12_4_ = local_5c0._12_4_ * fVar259;
    auVar156._16_4_ = local_5c0._16_4_ * 0.0;
    auVar156._20_4_ = local_5c0._20_4_ * 0.0;
    auVar156._28_36_ = auVar235._28_36_;
    auVar156._24_4_ = local_5c0._24_4_ * 0.0;
    auVar235._0_4_ = local_5e0._0_4_ * fVar172;
    auVar235._4_4_ = local_5e0._4_4_ * fVar256;
    auVar235._8_4_ = local_5e0._8_4_ * fVar257;
    auVar235._12_4_ = local_5e0._12_4_ * fVar259;
    auVar235._16_4_ = local_5e0._16_4_ * 0.0;
    auVar235._20_4_ = local_5e0._20_4_ * 0.0;
    auVar235._28_36_ = auVar242._28_36_;
    auVar235._24_4_ = local_5e0._24_4_ * 0.0;
    auVar242._0_4_ = local_600._0_4_ * fVar172;
    auVar242._4_4_ = local_600._4_4_ * fVar256;
    auVar242._8_4_ = local_600._8_4_ * fVar257;
    auVar242._12_4_ = local_600._12_4_ * fVar259;
    auVar242._16_4_ = local_600._16_4_ * 0.0;
    auVar242._20_4_ = local_600._20_4_ * 0.0;
    auVar242._28_36_ = auVar249._28_36_;
    auVar242._24_4_ = local_600._24_4_ * 0.0;
    auVar87._4_4_ = uStack_51c;
    auVar87._0_4_ = local_520;
    auVar87._8_4_ = uStack_518;
    auVar87._12_4_ = uStack_514;
    auVar87._16_4_ = uStack_510;
    auVar87._20_4_ = uStack_50c;
    auVar87._24_4_ = uStack_508;
    auVar87._28_4_ = uStack_504;
    auVar105 = vfmadd231ps_fma(auVar210,auVar115,auVar87);
    auVar101 = vfmadd231ps_fma(auVar156._0_32_,auVar115,local_540);
    auVar106 = vfmadd231ps_fma(auVar235._0_32_,auVar115,local_560);
    auVar1 = vfmadd231ps_fma(auVar242._0_32_,auVar115,local_580);
    auVar85._4_4_ = uStack_61c;
    auVar85._0_4_ = local_620;
    auVar85._8_4_ = uStack_618;
    auVar85._12_4_ = uStack_614;
    auVar85._16_4_ = uStack_610;
    auVar85._20_4_ = uStack_60c;
    auVar85._24_4_ = uStack_608;
    auVar85._28_4_ = uStack_604;
    auVar118 = vmulps_avx512vl(auVar85,ZEXT1632(auVar104));
    auVar124 = ZEXT1632(auVar104);
    auVar119 = vmulps_avx512vl(local_640,auVar124);
    auVar120 = vmulps_avx512vl(local_660,auVar124);
    auVar116 = vmulps_avx512vl(local_680,auVar124);
    auVar102 = vfmadd231ps_fma(auVar118,auVar115,auVar86);
    auVar107 = vfmadd231ps_fma(auVar119,auVar115,local_5c0);
    auVar108 = vfmadd231ps_fma(auVar120,auVar115,local_5e0);
    auVar109 = vfmadd231ps_fma(auVar116,auVar115,local_600);
    auVar46._4_4_ = fVar256 * (float)local_6a0._4_4_;
    auVar46._0_4_ = fVar172 * (float)local_6a0._0_4_;
    auVar46._8_4_ = fVar257 * fStack_698;
    auVar46._12_4_ = fVar259 * fStack_694;
    auVar46._16_4_ = fStack_690 * 0.0;
    auVar46._20_4_ = fStack_68c * 0.0;
    auVar46._24_4_ = fStack_688 * 0.0;
    auVar46._28_4_ = fStack_584;
    auVar47._4_4_ = fVar256 * (float)local_6c0._4_4_;
    auVar47._0_4_ = fVar172 * (float)local_6c0._0_4_;
    auVar47._8_4_ = fVar257 * fStack_6b8;
    auVar47._12_4_ = fVar259 * fStack_6b4;
    auVar47._16_4_ = fStack_6b0 * 0.0;
    auVar47._20_4_ = fStack_6ac * 0.0;
    auVar47._24_4_ = fStack_6a8 * 0.0;
    auVar47._28_4_ = local_5c0._28_4_;
    auVar48._4_4_ = fVar256 * (float)local_6e0._4_4_;
    auVar48._0_4_ = fVar172 * (float)local_6e0._0_4_;
    auVar48._8_4_ = fVar257 * fStack_6d8;
    auVar48._12_4_ = fVar259 * fStack_6d4;
    auVar48._16_4_ = fStack_6d0 * 0.0;
    auVar48._20_4_ = fStack_6cc * 0.0;
    auVar48._24_4_ = fStack_6c8 * 0.0;
    auVar48._28_4_ = local_5e0._28_4_;
    auVar49._4_4_ = fVar256 * (float)local_700._4_4_;
    auVar49._0_4_ = fVar172 * (float)local_700._0_4_;
    auVar49._8_4_ = fVar257 * fStack_6f8;
    auVar49._12_4_ = fVar259 * fStack_6f4;
    auVar49._16_4_ = fStack_6f0 * 0.0;
    auVar49._20_4_ = fStack_6ec * 0.0;
    auVar49._24_4_ = fStack_6e8 * 0.0;
    auVar49._28_4_ = local_600._28_4_;
    auVar118 = vfmadd231ps_avx512vl(auVar46,auVar115,auVar85);
    auVar119 = vfmadd231ps_avx512vl(auVar47,auVar115,local_640);
    auVar120 = vfmadd231ps_avx512vl(auVar48,auVar115,local_660);
    auVar116 = vfmadd231ps_avx512vl(auVar49,auVar115,local_680);
    auVar121 = vmulps_avx512vl(auVar124,ZEXT1632(auVar102));
    auVar122 = vmulps_avx512vl(auVar124,ZEXT1632(auVar107));
    auVar123 = vmulps_avx512vl(auVar124,ZEXT1632(auVar108));
    auVar124 = vmulps_avx512vl(auVar124,ZEXT1632(auVar109));
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar115,ZEXT1632(auVar105));
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar115,ZEXT1632(auVar101));
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar115,ZEXT1632(auVar106));
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar115,ZEXT1632(auVar1));
    auVar211._0_4_ = auVar118._0_4_ * fVar172;
    auVar211._4_4_ = auVar118._4_4_ * fVar256;
    auVar211._8_4_ = auVar118._8_4_ * fVar257;
    auVar211._12_4_ = auVar118._12_4_ * fVar259;
    auVar211._16_4_ = auVar118._16_4_ * 0.0;
    auVar211._20_4_ = auVar118._20_4_ * 0.0;
    auVar211._24_4_ = auVar118._24_4_ * 0.0;
    auVar211._28_4_ = 0;
    auVar50._4_4_ = auVar119._4_4_ * fVar256;
    auVar50._0_4_ = auVar119._0_4_ * fVar172;
    auVar50._8_4_ = auVar119._8_4_ * fVar257;
    auVar50._12_4_ = auVar119._12_4_ * fVar259;
    auVar50._16_4_ = auVar119._16_4_ * 0.0;
    auVar50._20_4_ = auVar119._20_4_ * 0.0;
    auVar50._24_4_ = auVar119._24_4_ * 0.0;
    auVar50._28_4_ = auVar118._28_4_;
    auVar51._4_4_ = auVar120._4_4_ * fVar256;
    auVar51._0_4_ = auVar120._0_4_ * fVar172;
    auVar51._8_4_ = auVar120._8_4_ * fVar257;
    auVar51._12_4_ = auVar120._12_4_ * fVar259;
    auVar51._16_4_ = auVar120._16_4_ * 0.0;
    auVar51._20_4_ = auVar120._20_4_ * 0.0;
    auVar51._24_4_ = auVar120._24_4_ * 0.0;
    auVar51._28_4_ = auVar119._28_4_;
    auVar52._4_4_ = auVar116._4_4_ * fVar256;
    auVar52._0_4_ = auVar116._0_4_ * fVar172;
    auVar52._8_4_ = auVar116._8_4_ * fVar257;
    auVar52._12_4_ = auVar116._12_4_ * fVar259;
    auVar52._16_4_ = auVar116._16_4_ * 0.0;
    auVar52._20_4_ = auVar116._20_4_ * 0.0;
    auVar52._24_4_ = auVar116._24_4_ * 0.0;
    auVar52._28_4_ = auVar120._28_4_;
    auVar105 = vfmadd231ps_fma(auVar211,auVar115,ZEXT1632(auVar102));
    auVar101 = vfmadd231ps_fma(auVar50,auVar115,ZEXT1632(auVar107));
    auVar106 = vfmadd231ps_fma(auVar51,auVar115,ZEXT1632(auVar108));
    auVar1 = vfmadd231ps_fma(auVar52,auVar115,ZEXT1632(auVar109));
    auVar118 = vmulps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar106));
    auVar116 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar259 * auVar105._12_4_,
                                             CONCAT48(fVar257 * auVar105._8_4_,
                                                      CONCAT44(fVar256 * auVar105._4_4_,
                                                               fVar172 * auVar105._0_4_)))),auVar115
                          ,auVar121);
    auVar249 = ZEXT3264(auVar116);
    auVar114 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar101._12_4_ * fVar259,
                                             CONCAT48(auVar101._8_4_ * fVar257,
                                                      CONCAT44(auVar101._4_4_ * fVar256,
                                                               auVar101._0_4_ * fVar172)))),auVar115
                          ,auVar122);
    auVar125 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar123);
    auVar119 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar1._12_4_ * fVar259,
                                             CONCAT48(auVar1._8_4_ * fVar257,
                                                      CONCAT44(auVar1._4_4_ * fVar256,
                                                               auVar1._0_4_ * fVar172)))),auVar124,
                          auVar115);
    auVar115 = vsubps_avx512vl(ZEXT1632(auVar105),auVar121);
    auVar118 = vsubps_avx512vl(ZEXT1632(auVar101),auVar122);
    auVar120 = vsubps_avx512vl(ZEXT1632(auVar106),auVar123);
    auVar121 = vsubps_avx512vl(ZEXT1632(auVar1),auVar124);
    auVar268._0_4_ = fVar266 * auVar115._0_4_ * 3.0;
    auVar268._4_4_ = fVar266 * auVar115._4_4_ * 3.0;
    auVar268._8_4_ = fVar266 * auVar115._8_4_ * 3.0;
    auVar268._12_4_ = fVar266 * auVar115._12_4_ * 3.0;
    auVar268._16_4_ = fVar266 * auVar115._16_4_ * 3.0;
    auVar268._20_4_ = fVar266 * auVar115._20_4_ * 3.0;
    auVar268._24_4_ = fVar266 * auVar115._24_4_ * 3.0;
    auVar268._28_4_ = 0;
    auVar270._0_4_ = fVar266 * auVar118._0_4_ * 3.0;
    auVar270._4_4_ = fVar266 * auVar118._4_4_ * 3.0;
    auVar270._8_4_ = fVar266 * auVar118._8_4_ * 3.0;
    auVar270._12_4_ = fVar266 * auVar118._12_4_ * 3.0;
    auVar270._16_4_ = fVar266 * auVar118._16_4_ * 3.0;
    auVar270._20_4_ = fVar266 * auVar118._20_4_ * 3.0;
    auVar270._24_4_ = fVar266 * auVar118._24_4_ * 3.0;
    auVar270._28_4_ = 0;
    auVar271._0_4_ = auVar120._0_4_ * 3.0 * fVar266;
    auVar271._4_4_ = auVar120._4_4_ * 3.0 * fVar266;
    auVar271._8_4_ = auVar120._8_4_ * 3.0 * fVar266;
    auVar271._12_4_ = auVar120._12_4_ * 3.0 * fVar266;
    auVar271._16_4_ = auVar120._16_4_ * 3.0 * fVar266;
    auVar271._20_4_ = auVar120._20_4_ * 3.0 * fVar266;
    auVar271._24_4_ = auVar120._24_4_ * 3.0 * fVar266;
    auVar271._28_4_ = 0;
    fVar172 = auVar121._0_4_ * 3.0 * fVar266;
    fVar256 = auVar121._4_4_ * 3.0 * fVar266;
    auVar53._4_4_ = fVar256;
    auVar53._0_4_ = fVar172;
    fVar257 = auVar121._8_4_ * 3.0 * fVar266;
    auVar53._8_4_ = fVar257;
    fVar259 = auVar121._12_4_ * 3.0 * fVar266;
    auVar53._12_4_ = fVar259;
    fVar261 = auVar121._16_4_ * 3.0 * fVar266;
    auVar53._16_4_ = fVar261;
    fVar236 = auVar121._20_4_ * 3.0 * fVar266;
    auVar53._20_4_ = fVar236;
    fVar262 = auVar121._24_4_ * 3.0 * fVar266;
    auVar53._24_4_ = fVar262;
    auVar53._28_4_ = fVar266;
    auVar104 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar121 = vpermt2ps_avx512vl(auVar116,_DAT_0205fd20,ZEXT1632(auVar104));
    auVar122 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,ZEXT1632(auVar104));
    auVar120 = ZEXT1632(auVar104);
    auVar123 = vpermt2ps_avx512vl(auVar125,_DAT_0205fd20,auVar120);
    auVar212._0_4_ = auVar119._0_4_ + fVar172;
    auVar212._4_4_ = auVar119._4_4_ + fVar256;
    auVar212._8_4_ = auVar119._8_4_ + fVar257;
    auVar212._12_4_ = auVar119._12_4_ + fVar259;
    auVar212._16_4_ = auVar119._16_4_ + fVar261;
    auVar212._20_4_ = auVar119._20_4_ + fVar236;
    auVar212._24_4_ = auVar119._24_4_ + fVar262;
    auVar212._28_4_ = auVar119._28_4_ + fVar266;
    auVar115 = vmaxps_avx(auVar119,auVar212);
    auVar118 = vminps_avx(auVar119,auVar212);
    auVar124 = vpermt2ps_avx512vl(auVar119,_DAT_0205fd20,auVar120);
    auVar126 = vpermt2ps_avx512vl(auVar268,_DAT_0205fd20,auVar120);
    auVar112 = vpermt2ps_avx512vl(auVar270,_DAT_0205fd20,auVar120);
    auVar138 = ZEXT1632(auVar104);
    auVar113 = vpermt2ps_avx512vl(auVar271,_DAT_0205fd20,auVar138);
    auVar119 = vpermt2ps_avx512vl(auVar53,_DAT_0205fd20,auVar138);
    auVar127 = vsubps_avx512vl(auVar124,auVar119);
    auVar119 = vsubps_avx(auVar121,auVar116);
    auVar120 = vsubps_avx(auVar122,auVar114);
    auVar128 = vsubps_avx512vl(auVar123,auVar125);
    auVar129 = vmulps_avx512vl(auVar120,auVar271);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar270,auVar128);
    auVar130 = vmulps_avx512vl(auVar128,auVar268);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar271,auVar119);
    auVar131 = vmulps_avx512vl(auVar119,auVar270);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar268,auVar120);
    auVar131 = vmulps_avx512vl(auVar131,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar130,auVar130);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar129);
    auVar130 = vmulps_avx512vl(auVar128,auVar128);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar120,auVar120);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar119,auVar119);
    auVar131 = vrcp14ps_avx512vl(auVar130);
    auVar132 = vfnmadd213ps_avx512vl(auVar131,auVar130,auVar181);
    auVar131 = vfmadd132ps_avx512vl(auVar132,auVar131,auVar131);
    auVar129 = vmulps_avx512vl(auVar129,auVar131);
    auVar132 = vmulps_avx512vl(auVar120,auVar113);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar112,auVar128);
    auVar133 = vmulps_avx512vl(auVar128,auVar126);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar113,auVar119);
    auVar134 = vmulps_avx512vl(auVar119,auVar112);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar126,auVar120);
    auVar134 = vmulps_avx512vl(auVar134,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar131 = vmulps_avx512vl(auVar132,auVar131);
    auVar129 = vmaxps_avx512vl(auVar129,auVar131);
    auVar129 = vsqrtps_avx512vl(auVar129);
    auVar131 = vmaxps_avx512vl(auVar127,auVar124);
    auVar115 = vmaxps_avx512vl(auVar115,auVar131);
    auVar131 = vaddps_avx512vl(auVar129,auVar115);
    auVar115 = vminps_avx512vl(auVar127,auVar124);
    auVar115 = vminps_avx(auVar118,auVar115);
    auVar115 = vsubps_avx512vl(auVar115,auVar129);
    auVar143._8_4_ = 0x3f800002;
    auVar143._0_8_ = 0x3f8000023f800002;
    auVar143._12_4_ = 0x3f800002;
    auVar143._16_4_ = 0x3f800002;
    auVar143._20_4_ = 0x3f800002;
    auVar143._24_4_ = 0x3f800002;
    auVar143._28_4_ = 0x3f800002;
    auVar118 = vmulps_avx512vl(auVar131,auVar143);
    auVar144._8_4_ = 0x3f7ffffc;
    auVar144._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar144._12_4_ = 0x3f7ffffc;
    auVar144._16_4_ = 0x3f7ffffc;
    auVar144._20_4_ = 0x3f7ffffc;
    auVar144._24_4_ = 0x3f7ffffc;
    auVar144._28_4_ = 0x3f7ffffc;
    local_a80 = vmulps_avx512vl(auVar115,auVar144);
    auVar54._4_4_ = auVar118._4_4_ * auVar118._4_4_;
    auVar54._0_4_ = auVar118._0_4_ * auVar118._0_4_;
    auVar54._8_4_ = auVar118._8_4_ * auVar118._8_4_;
    auVar54._12_4_ = auVar118._12_4_ * auVar118._12_4_;
    auVar54._16_4_ = auVar118._16_4_ * auVar118._16_4_;
    auVar54._20_4_ = auVar118._20_4_ * auVar118._20_4_;
    auVar54._24_4_ = auVar118._24_4_ * auVar118._24_4_;
    auVar54._28_4_ = local_a80._28_4_;
    auVar115 = vrsqrt14ps_avx512vl(auVar130);
    auVar145._8_4_ = 0xbf000000;
    auVar145._0_8_ = 0xbf000000bf000000;
    auVar145._12_4_ = 0xbf000000;
    auVar145._16_4_ = 0xbf000000;
    auVar145._20_4_ = 0xbf000000;
    auVar145._24_4_ = 0xbf000000;
    auVar145._28_4_ = 0xbf000000;
    auVar118 = vmulps_avx512vl(auVar130,auVar145);
    auVar55._4_4_ = auVar115._4_4_ * auVar118._4_4_;
    auVar55._0_4_ = auVar115._0_4_ * auVar118._0_4_;
    auVar55._8_4_ = auVar115._8_4_ * auVar118._8_4_;
    auVar55._12_4_ = auVar115._12_4_ * auVar118._12_4_;
    auVar55._16_4_ = auVar115._16_4_ * auVar118._16_4_;
    auVar55._20_4_ = auVar115._20_4_ * auVar118._20_4_;
    auVar55._24_4_ = auVar115._24_4_ * auVar118._24_4_;
    auVar55._28_4_ = auVar118._28_4_;
    auVar118 = vmulps_avx512vl(auVar115,auVar115);
    auVar118 = vmulps_avx512vl(auVar118,auVar55);
    auVar33._8_4_ = 0x3fc00000;
    auVar33._0_8_ = 0x3fc000003fc00000;
    auVar33._12_4_ = 0x3fc00000;
    auVar33._16_4_ = 0x3fc00000;
    auVar33._20_4_ = 0x3fc00000;
    auVar33._24_4_ = 0x3fc00000;
    auVar33._28_4_ = 0x3fc00000;
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar33);
    auVar56._4_4_ = auVar118._4_4_ * auVar119._4_4_;
    auVar56._0_4_ = auVar118._0_4_ * auVar119._0_4_;
    auVar56._8_4_ = auVar118._8_4_ * auVar119._8_4_;
    auVar56._12_4_ = auVar118._12_4_ * auVar119._12_4_;
    auVar56._16_4_ = auVar118._16_4_ * auVar119._16_4_;
    auVar56._20_4_ = auVar118._20_4_ * auVar119._20_4_;
    auVar56._24_4_ = auVar118._24_4_ * auVar119._24_4_;
    auVar56._28_4_ = auVar115._28_4_;
    auVar115 = vmulps_avx512vl(auVar120,auVar118);
    auVar124 = vmulps_avx512vl(auVar128,auVar118);
    auVar127 = vsubps_avx512vl(auVar138,auVar116);
    auVar129 = vsubps_avx512vl(auVar138,auVar114);
    auVar130 = vsubps_avx512vl(auVar138,auVar125);
    auVar131 = vmulps_avx512vl(auVar272._0_32_,auVar130);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar157._0_32_,auVar129);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar117,auVar127);
    auVar132 = vmulps_avx512vl(auVar130,auVar130);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar129,auVar129);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar127,auVar127);
    auVar133 = vmulps_avx512vl(auVar272._0_32_,auVar124);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar115,auVar157._0_32_);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar56,auVar117);
    auVar124 = vmulps_avx512vl(auVar130,auVar124);
    auVar115 = vfmadd231ps_avx512vl(auVar124,auVar129,auVar115);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar127,auVar56);
    local_8e0 = vmulps_avx512vl(auVar133,auVar133);
    auVar124 = vsubps_avx512vl(local_720,local_8e0);
    auVar134 = vmulps_avx512vl(auVar133,auVar115);
    auVar131 = vsubps_avx512vl(auVar131,auVar134);
    auVar131 = vaddps_avx512vl(auVar131,auVar131);
    auVar134 = vmulps_avx512vl(auVar115,auVar115);
    auVar132 = vsubps_avx512vl(auVar132,auVar134);
    auVar134 = vsubps_avx512vl(auVar132,auVar54);
    auVar135 = vmulps_avx512vl(auVar131,auVar131);
    auVar34._8_4_ = 0x40800000;
    auVar34._0_8_ = 0x4080000040800000;
    auVar34._12_4_ = 0x40800000;
    auVar34._16_4_ = 0x40800000;
    auVar34._20_4_ = 0x40800000;
    auVar34._24_4_ = 0x40800000;
    auVar34._28_4_ = 0x40800000;
    auVar136 = vmulps_avx512vl(auVar124,auVar34);
    auVar137 = vmulps_avx512vl(auVar136,auVar134);
    auVar137 = vsubps_avx512vl(auVar135,auVar137);
    auVar104 = vxorps_avx512vl(auVar132._0_16_,auVar132._0_16_);
    uVar100 = vcmpps_avx512vl(auVar137,auVar138,5);
    bVar88 = (byte)uVar100;
    if (bVar88 == 0) {
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar137 = vsqrtps_avx512vl(auVar137);
      auVar138 = vaddps_avx512vl(auVar124,auVar124);
      auVar139 = vrcp14ps_avx512vl(auVar138);
      auVar138 = vfnmadd213ps_avx512vl(auVar138,auVar139,auVar181);
      auVar138 = vfmadd132ps_avx512vl(auVar138,auVar139,auVar139);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar139 = vxorps_avx512vl(auVar131,auVar35);
      auVar139 = vsubps_avx512vl(auVar139,auVar137);
      auVar139 = vmulps_avx512vl(auVar139,auVar138);
      auVar137 = vsubps_avx512vl(auVar137,auVar131);
      auVar137 = vmulps_avx512vl(auVar137,auVar138);
      auVar138 = vfmadd213ps_avx512vl(auVar133,auVar139,auVar115);
      local_820 = vmulps_avx512vl(auVar118,auVar138);
      auVar138 = vfmadd213ps_avx512vl(auVar133,auVar137,auVar115);
      local_840 = vmulps_avx512vl(auVar118,auVar138);
      auVar182._8_4_ = 0x7f800000;
      auVar182._0_8_ = 0x7f8000007f800000;
      auVar182._12_4_ = 0x7f800000;
      auVar182._16_4_ = 0x7f800000;
      auVar182._20_4_ = 0x7f800000;
      auVar182._24_4_ = 0x7f800000;
      auVar182._28_4_ = 0x7f800000;
      auVar138 = vblendmps_avx512vl(auVar182,auVar139);
      auVar140._0_4_ =
           (uint)(bVar88 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar88 & 1) * local_840._0_4_;
      bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
      auVar140._4_4_ = (uint)bVar7 * auVar138._4_4_ | (uint)!bVar7 * local_840._4_4_;
      bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
      auVar140._8_4_ = (uint)bVar7 * auVar138._8_4_ | (uint)!bVar7 * local_840._8_4_;
      bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
      auVar140._12_4_ = (uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * local_840._12_4_;
      bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
      auVar140._16_4_ = (uint)bVar7 * auVar138._16_4_ | (uint)!bVar7 * local_840._16_4_;
      bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
      auVar140._20_4_ = (uint)bVar7 * auVar138._20_4_ | (uint)!bVar7 * local_840._20_4_;
      bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
      auVar140._24_4_ = (uint)bVar7 * auVar138._24_4_ | (uint)!bVar7 * local_840._24_4_;
      bVar7 = SUB81(uVar100 >> 7,0);
      auVar140._28_4_ = (uint)bVar7 * auVar138._28_4_ | (uint)!bVar7 * local_840._28_4_;
      auVar183._8_4_ = 0xff800000;
      auVar183._0_8_ = 0xff800000ff800000;
      auVar183._12_4_ = 0xff800000;
      auVar183._16_4_ = 0xff800000;
      auVar183._20_4_ = 0xff800000;
      auVar183._24_4_ = 0xff800000;
      auVar183._28_4_ = 0xff800000;
      auVar138 = vblendmps_avx512vl(auVar183,auVar137);
      auVar141._0_4_ =
           (uint)(bVar88 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar137._0_4_;
      bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
      auVar141._4_4_ = (uint)bVar7 * auVar138._4_4_ | (uint)!bVar7 * auVar137._4_4_;
      bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
      auVar141._8_4_ = (uint)bVar7 * auVar138._8_4_ | (uint)!bVar7 * auVar137._8_4_;
      bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
      auVar141._12_4_ = (uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar137._12_4_;
      bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
      auVar141._16_4_ = (uint)bVar7 * auVar138._16_4_ | (uint)!bVar7 * auVar137._16_4_;
      bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
      auVar141._20_4_ = (uint)bVar7 * auVar138._20_4_ | (uint)!bVar7 * auVar137._20_4_;
      bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
      auVar141._24_4_ = (uint)bVar7 * auVar138._24_4_ | (uint)!bVar7 * auVar137._24_4_;
      bVar7 = SUB81(uVar100 >> 7,0);
      auVar141._28_4_ = (uint)bVar7 * auVar138._28_4_ | (uint)!bVar7 * auVar137._28_4_;
      auVar184._8_4_ = 0x7fffffff;
      auVar184._0_8_ = 0x7fffffff7fffffff;
      auVar184._12_4_ = 0x7fffffff;
      auVar184._16_4_ = 0x7fffffff;
      auVar184._20_4_ = 0x7fffffff;
      auVar184._24_4_ = 0x7fffffff;
      auVar184._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_8e0,auVar184);
      auVar137 = vmaxps_avx512vl(local_7e0,local_8e0);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      auVar138 = vmulps_avx512vl(auVar137,auVar36);
      auVar137 = vandps_avx(auVar124,auVar184);
      uVar96 = vcmpps_avx512vl(auVar137,auVar138,1);
      uVar100 = uVar100 & uVar96;
      bVar95 = (byte)uVar100;
      if (bVar95 != 0) {
        uVar96 = vcmpps_avx512vl(auVar134,ZEXT1632(auVar104),2);
        auVar218._8_4_ = 0xff800000;
        auVar218._0_8_ = 0xff800000ff800000;
        auVar218._12_4_ = 0xff800000;
        auVar218._16_4_ = 0xff800000;
        auVar218._20_4_ = 0xff800000;
        auVar218._24_4_ = 0xff800000;
        auVar218._28_4_ = 0xff800000;
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar138 = vblendmps_avx512vl(auVar134,auVar218);
        bVar91 = (byte)uVar96;
        uVar93 = (uint)(bVar91 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar137._0_4_;
        bVar7 = (bool)((byte)(uVar96 >> 1) & 1);
        uVar165 = (uint)bVar7 * auVar138._4_4_ | (uint)!bVar7 * auVar137._4_4_;
        bVar7 = (bool)((byte)(uVar96 >> 2) & 1);
        uVar166 = (uint)bVar7 * auVar138._8_4_ | (uint)!bVar7 * auVar137._8_4_;
        bVar7 = (bool)((byte)(uVar96 >> 3) & 1);
        uVar167 = (uint)bVar7 * auVar138._12_4_ | (uint)!bVar7 * auVar137._12_4_;
        bVar7 = (bool)((byte)(uVar96 >> 4) & 1);
        uVar168 = (uint)bVar7 * auVar138._16_4_ | (uint)!bVar7 * auVar137._16_4_;
        bVar7 = (bool)((byte)(uVar96 >> 5) & 1);
        uVar169 = (uint)bVar7 * auVar138._20_4_ | (uint)!bVar7 * auVar137._20_4_;
        bVar7 = (bool)((byte)(uVar96 >> 6) & 1);
        uVar170 = (uint)bVar7 * auVar138._24_4_ | (uint)!bVar7 * auVar137._24_4_;
        bVar7 = SUB81(uVar96 >> 7,0);
        uVar171 = (uint)bVar7 * auVar138._28_4_ | (uint)!bVar7 * auVar137._28_4_;
        auVar140._0_4_ = (bVar95 & 1) * uVar93 | !(bool)(bVar95 & 1) * auVar140._0_4_;
        bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar140._4_4_ = bVar7 * uVar165 | !bVar7 * auVar140._4_4_;
        bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar140._8_4_ = bVar7 * uVar166 | !bVar7 * auVar140._8_4_;
        bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar140._12_4_ = bVar7 * uVar167 | !bVar7 * auVar140._12_4_;
        bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar140._16_4_ = bVar7 * uVar168 | !bVar7 * auVar140._16_4_;
        bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar140._20_4_ = bVar7 * uVar169 | !bVar7 * auVar140._20_4_;
        bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar140._24_4_ = bVar7 * uVar170 | !bVar7 * auVar140._24_4_;
        bVar7 = SUB81(uVar100 >> 7,0);
        auVar140._28_4_ = bVar7 * uVar171 | !bVar7 * auVar140._28_4_;
        auVar134 = vblendmps_avx512vl(auVar218,auVar134);
        bVar7 = (bool)((byte)(uVar96 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar96 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar96 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar96 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar96 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar96 >> 6) & 1);
        bVar13 = SUB81(uVar96 >> 7,0);
        auVar141._0_4_ =
             (uint)(bVar95 & 1) *
             ((uint)(bVar91 & 1) * auVar134._0_4_ | !(bool)(bVar91 & 1) * uVar93) |
             !(bool)(bVar95 & 1) * auVar141._0_4_;
        bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar141._4_4_ =
             (uint)bVar99 * ((uint)bVar7 * auVar134._4_4_ | !bVar7 * uVar165) |
             !bVar99 * auVar141._4_4_;
        bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar141._8_4_ =
             (uint)bVar7 * ((uint)bVar8 * auVar134._8_4_ | !bVar8 * uVar166) |
             !bVar7 * auVar141._8_4_;
        bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar141._12_4_ =
             (uint)bVar7 * ((uint)bVar9 * auVar134._12_4_ | !bVar9 * uVar167) |
             !bVar7 * auVar141._12_4_;
        bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar141._16_4_ =
             (uint)bVar7 * ((uint)bVar10 * auVar134._16_4_ | !bVar10 * uVar168) |
             !bVar7 * auVar141._16_4_;
        bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar141._20_4_ =
             (uint)bVar7 * ((uint)bVar11 * auVar134._20_4_ | !bVar11 * uVar169) |
             !bVar7 * auVar141._20_4_;
        bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar141._24_4_ =
             (uint)bVar7 * ((uint)bVar12 * auVar134._24_4_ | !bVar12 * uVar170) |
             !bVar7 * auVar141._24_4_;
        bVar7 = SUB81(uVar100 >> 7,0);
        auVar141._28_4_ =
             (uint)bVar7 * ((uint)bVar13 * auVar134._28_4_ | !bVar13 * uVar171) |
             !bVar7 * auVar141._28_4_;
        bVar88 = (~bVar95 | bVar91) & bVar88;
      }
      auVar181._8_4_ = 0x3f800000;
      auVar181._0_8_ = &DAT_3f8000003f800000;
      auVar181._12_4_ = 0x3f800000;
      auVar181._16_4_ = 0x3f800000;
      auVar181._20_4_ = 0x3f800000;
      auVar181._24_4_ = 0x3f800000;
      auVar181._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar141);
    if ((bVar88 & 0x7f) == 0) {
      auVar242 = ZEXT3264(_DAT_02020f20);
      auVar193._0_32_ = local_aa0;
      auVar272 = ZEXT3264(local_aa0);
    }
    else {
      fVar172 = *(float *)(ray + k * 4 + 0x200) - (float)local_a00._0_4_;
      auVar185._4_4_ = fVar172;
      auVar185._0_4_ = fVar172;
      auVar185._8_4_ = fVar172;
      auVar185._12_4_ = fVar172;
      auVar185._16_4_ = fVar172;
      auVar185._20_4_ = fVar172;
      auVar185._24_4_ = fVar172;
      auVar185._28_4_ = fVar172;
      auVar134 = vminps_avx512vl(auVar185,auVar141);
      auVar84._4_4_ = fStack_73c;
      auVar84._0_4_ = local_740;
      auVar84._8_4_ = fStack_738;
      auVar84._12_4_ = fStack_734;
      auVar84._16_4_ = fStack_730;
      auVar84._20_4_ = fStack_72c;
      auVar84._24_4_ = fStack_728;
      auVar84._28_4_ = fStack_724;
      auVar137 = vmaxps_avx512vl(auVar84,auVar140);
      auVar130 = vmulps_avx512vl(auVar130,auVar271);
      auVar129 = vfmadd213ps_avx512vl(auVar129,auVar270,auVar130);
      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar268,auVar129);
      auVar272 = ZEXT3264(local_aa0);
      auVar129 = vmulps_avx512vl(local_aa0,auVar271);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar157._0_32_,auVar270);
      in_ZMM31 = ZEXT3264(auVar117);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar117,auVar268);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar129,auVar130);
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar23 = vcmpps_avx512vl(auVar130,auVar138,1);
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar127 = vxorps_avx512vl(auVar127,auVar139);
      auVar142 = vrcp14ps_avx512vl(auVar129);
      auVar143 = vxorps_avx512vl(auVar129,auVar139);
      auVar144 = vfnmadd213ps_avx512vl(auVar142,auVar129,auVar181);
      auVar144 = vfmadd132ps_avx512vl(auVar144,auVar142,auVar142);
      auVar144 = vmulps_avx512vl(auVar144,auVar127);
      uVar25 = vcmpps_avx512vl(auVar129,auVar143,1);
      bVar95 = (byte)uVar23 | (byte)uVar25;
      auVar145 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar127 = vblendmps_avx512vl(auVar144,auVar145);
      auVar146._0_4_ =
           (uint)(bVar95 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar95 & 1) * auVar142._0_4_;
      bVar7 = (bool)(bVar95 >> 1 & 1);
      auVar146._4_4_ = (uint)bVar7 * auVar127._4_4_ | (uint)!bVar7 * auVar142._4_4_;
      bVar7 = (bool)(bVar95 >> 2 & 1);
      auVar146._8_4_ = (uint)bVar7 * auVar127._8_4_ | (uint)!bVar7 * auVar142._8_4_;
      bVar7 = (bool)(bVar95 >> 3 & 1);
      auVar146._12_4_ = (uint)bVar7 * auVar127._12_4_ | (uint)!bVar7 * auVar142._12_4_;
      bVar7 = (bool)(bVar95 >> 4 & 1);
      auVar146._16_4_ = (uint)bVar7 * auVar127._16_4_ | (uint)!bVar7 * auVar142._16_4_;
      bVar7 = (bool)(bVar95 >> 5 & 1);
      auVar146._20_4_ = (uint)bVar7 * auVar127._20_4_ | (uint)!bVar7 * auVar142._20_4_;
      bVar7 = (bool)(bVar95 >> 6 & 1);
      auVar146._24_4_ = (uint)bVar7 * auVar127._24_4_ | (uint)!bVar7 * auVar142._24_4_;
      auVar146._28_4_ =
           (uint)(bVar95 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar95 >> 7) * auVar142._28_4_;
      auVar127 = vmaxps_avx(auVar137,auVar146);
      uVar25 = vcmpps_avx512vl(auVar129,auVar143,6);
      bVar95 = (byte)uVar23 | (byte)uVar25;
      auVar147._0_4_ = (uint)(bVar95 & 1) * 0x7f800000 | (uint)!(bool)(bVar95 & 1) * auVar144._0_4_;
      bVar7 = (bool)(bVar95 >> 1 & 1);
      auVar147._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar144._4_4_;
      bVar7 = (bool)(bVar95 >> 2 & 1);
      auVar147._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar144._8_4_;
      bVar7 = (bool)(bVar95 >> 3 & 1);
      auVar147._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar144._12_4_;
      bVar7 = (bool)(bVar95 >> 4 & 1);
      auVar147._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar144._16_4_;
      bVar7 = (bool)(bVar95 >> 5 & 1);
      auVar147._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar144._20_4_;
      bVar7 = (bool)(bVar95 >> 6 & 1);
      auVar147._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * auVar144._24_4_;
      auVar147._28_4_ =
           (uint)(bVar95 >> 7) * 0x7f800000 | (uint)!(bool)(bVar95 >> 7) * auVar144._28_4_;
      auVar129 = vminps_avx(auVar134,auVar147);
      auVar104 = vxorps_avx512vl(auVar143._0_16_,auVar143._0_16_);
      auVar121 = vsubps_avx512vl(ZEXT1632(auVar104),auVar121);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar104),auVar122);
      auVar134 = ZEXT1632(auVar104);
      auVar123 = vsubps_avx512vl(auVar134,auVar123);
      auVar57._4_4_ = auVar123._4_4_ * auVar113._4_4_;
      auVar57._0_4_ = auVar123._0_4_ * auVar113._0_4_;
      auVar57._8_4_ = auVar123._8_4_ * auVar113._8_4_;
      auVar57._12_4_ = auVar123._12_4_ * auVar113._12_4_;
      auVar57._16_4_ = auVar123._16_4_ * auVar113._16_4_;
      auVar57._20_4_ = auVar123._20_4_ * auVar113._20_4_;
      auVar57._24_4_ = auVar123._24_4_ * auVar113._24_4_;
      auVar57._28_4_ = auVar123._28_4_;
      auVar122 = vfnmsub231ps_avx512vl(auVar57,auVar112,auVar122);
      auVar121 = vfnmadd231ps_avx512vl(auVar122,auVar126,auVar121);
      auVar122 = vmulps_avx512vl(local_aa0,auVar113);
      auVar122 = vfnmsub231ps_avx512vl(auVar122,auVar157._0_32_,auVar112);
      auVar122 = vfnmadd231ps_avx512vl(auVar122,auVar117,auVar126);
      vandps_avx512vl(auVar122,auVar130);
      uVar23 = vcmpps_avx512vl(auVar122,auVar138,1);
      auVar121 = vxorps_avx512vl(auVar121,auVar139);
      auVar123 = vrcp14ps_avx512vl(auVar122);
      auVar126 = vxorps_avx512vl(auVar122,auVar139);
      auVar113 = vfnmadd213ps_avx512vl(auVar123,auVar122,auVar181);
      auVar104 = vfmadd132ps_fma(auVar113,auVar123,auVar123);
      fVar172 = auVar104._0_4_ * auVar121._0_4_;
      fVar256 = auVar104._4_4_ * auVar121._4_4_;
      auVar58._4_4_ = fVar256;
      auVar58._0_4_ = fVar172;
      fVar257 = auVar104._8_4_ * auVar121._8_4_;
      auVar58._8_4_ = fVar257;
      fVar259 = auVar104._12_4_ * auVar121._12_4_;
      auVar58._12_4_ = fVar259;
      fVar266 = auVar121._16_4_ * 0.0;
      auVar58._16_4_ = fVar266;
      fVar261 = auVar121._20_4_ * 0.0;
      auVar58._20_4_ = fVar261;
      fVar236 = auVar121._24_4_ * 0.0;
      auVar58._24_4_ = fVar236;
      auVar58._28_4_ = auVar121._28_4_;
      uVar25 = vcmpps_avx512vl(auVar122,auVar126,1);
      bVar95 = (byte)uVar23 | (byte)uVar25;
      auVar113 = vblendmps_avx512vl(auVar58,auVar145);
      auVar148._0_4_ =
           (uint)(bVar95 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar95 & 1) * auVar123._0_4_;
      bVar7 = (bool)(bVar95 >> 1 & 1);
      auVar148._4_4_ = (uint)bVar7 * auVar113._4_4_ | (uint)!bVar7 * auVar123._4_4_;
      bVar7 = (bool)(bVar95 >> 2 & 1);
      auVar148._8_4_ = (uint)bVar7 * auVar113._8_4_ | (uint)!bVar7 * auVar123._8_4_;
      bVar7 = (bool)(bVar95 >> 3 & 1);
      auVar148._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * auVar123._12_4_;
      bVar7 = (bool)(bVar95 >> 4 & 1);
      auVar148._16_4_ = (uint)bVar7 * auVar113._16_4_ | (uint)!bVar7 * auVar123._16_4_;
      bVar7 = (bool)(bVar95 >> 5 & 1);
      auVar148._20_4_ = (uint)bVar7 * auVar113._20_4_ | (uint)!bVar7 * auVar123._20_4_;
      bVar7 = (bool)(bVar95 >> 6 & 1);
      auVar148._24_4_ = (uint)bVar7 * auVar113._24_4_ | (uint)!bVar7 * auVar123._24_4_;
      auVar148._28_4_ =
           (uint)(bVar95 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar95 >> 7) * auVar123._28_4_;
      _local_920 = vmaxps_avx(auVar127,auVar148);
      uVar25 = vcmpps_avx512vl(auVar122,auVar126,6);
      bVar95 = (byte)uVar23 | (byte)uVar25;
      auVar149._0_4_ = (uint)(bVar95 & 1) * 0x7f800000 | (uint)!(bool)(bVar95 & 1) * (int)fVar172;
      bVar7 = (bool)(bVar95 >> 1 & 1);
      auVar149._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar256;
      bVar7 = (bool)(bVar95 >> 2 & 1);
      auVar149._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar257;
      bVar7 = (bool)(bVar95 >> 3 & 1);
      auVar149._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar259;
      bVar7 = (bool)(bVar95 >> 4 & 1);
      auVar149._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar266;
      bVar7 = (bool)(bVar95 >> 5 & 1);
      auVar149._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar261;
      bVar7 = (bool)(bVar95 >> 6 & 1);
      auVar149._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar236;
      auVar149._28_4_ =
           (uint)(bVar95 >> 7) * 0x7f800000 | (uint)!(bool)(bVar95 >> 7) * auVar121._28_4_;
      local_7a0 = vminps_avx(auVar129,auVar149);
      uVar23 = vcmpps_avx512vl(_local_920,local_7a0,2);
      bVar88 = bVar88 & 0x7f & (byte)uVar23;
      if (bVar88 == 0) {
        auVar242 = ZEXT3264(_DAT_02020f20);
        auVar157._32_32_ = auVar193._32_32_;
        auVar193 = auVar157;
      }
      else {
        auVar123 = vmaxps_avx512vl(auVar134,local_a80);
        auVar121 = vminps_avx512vl(local_820,auVar181);
        auVar66 = ZEXT412(0);
        auVar122 = ZEXT1232(auVar66) << 0x20;
        auVar121 = vmaxps_avx(auVar121,ZEXT1232(auVar66) << 0x20);
        auVar126 = vminps_avx512vl(local_840,auVar181);
        auVar59._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
        auVar59._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
        auVar59._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
        auVar59._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
        auVar59._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
        auVar59._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
        auVar59._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
        auVar59._28_4_ = auVar121._28_4_ + 7.0;
        auVar104 = vfmadd213ps_fma(auVar59,local_a60,auVar252);
        local_820 = ZEXT1632(auVar104);
        auVar121 = vmaxps_avx(auVar126,ZEXT1232(auVar66) << 0x20);
        auVar60._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
        auVar60._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
        auVar60._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
        auVar60._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
        auVar60._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
        auVar60._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
        auVar60._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
        auVar60._28_4_ = auVar121._28_4_ + 7.0;
        auVar104 = vfmadd213ps_fma(auVar60,local_a60,auVar252);
        local_840 = ZEXT1632(auVar104);
        auVar186._0_4_ = auVar123._0_4_ * auVar123._0_4_;
        auVar186._4_4_ = auVar123._4_4_ * auVar123._4_4_;
        auVar186._8_4_ = auVar123._8_4_ * auVar123._8_4_;
        auVar186._12_4_ = auVar123._12_4_ * auVar123._12_4_;
        auVar186._16_4_ = auVar123._16_4_ * auVar123._16_4_;
        auVar186._20_4_ = auVar123._20_4_ * auVar123._20_4_;
        auVar186._24_4_ = auVar123._24_4_ * auVar123._24_4_;
        auVar186._28_4_ = 0;
        auVar121 = vsubps_avx(auVar132,auVar186);
        auVar123 = vmulps_avx512vl(auVar136,auVar121);
        auVar123 = vsubps_avx512vl(auVar135,auVar123);
        uVar23 = vcmpps_avx512vl(auVar123,ZEXT1232(auVar66) << 0x20,5);
        bVar95 = (byte)uVar23;
        if (bVar95 == 0) {
          auVar115 = ZEXT832(0) << 0x20;
          auVar118 = ZEXT832(0) << 0x20;
          auVar126 = ZEXT832(0) << 0x20;
          auVar112 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar151._8_4_ = 0xff800000;
          auVar151._0_8_ = 0xff800000ff800000;
          auVar151._12_4_ = 0xff800000;
          auVar151._16_4_ = 0xff800000;
          auVar151._20_4_ = 0xff800000;
          auVar151._24_4_ = 0xff800000;
          auVar151._28_4_ = 0xff800000;
        }
        else {
          auVar105 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
          uVar100 = vcmpps_avx512vl(auVar123,auVar134,5);
          auVar122 = vsqrtps_avx(auVar123);
          auVar213._0_4_ = auVar124._0_4_ + auVar124._0_4_;
          auVar213._4_4_ = auVar124._4_4_ + auVar124._4_4_;
          auVar213._8_4_ = auVar124._8_4_ + auVar124._8_4_;
          auVar213._12_4_ = auVar124._12_4_ + auVar124._12_4_;
          auVar213._16_4_ = auVar124._16_4_ + auVar124._16_4_;
          auVar213._20_4_ = auVar124._20_4_ + auVar124._20_4_;
          auVar213._24_4_ = auVar124._24_4_ + auVar124._24_4_;
          auVar213._28_4_ = auVar124._28_4_ + auVar124._28_4_;
          auVar123 = vrcp14ps_avx512vl(auVar213);
          auVar126 = vfnmadd213ps_avx512vl(auVar213,auVar123,auVar181);
          auVar104 = vfmadd132ps_fma(auVar126,auVar123,auVar123);
          auVar37._8_4_ = 0x80000000;
          auVar37._0_8_ = 0x8000000080000000;
          auVar37._12_4_ = 0x80000000;
          auVar37._16_4_ = 0x80000000;
          auVar37._20_4_ = 0x80000000;
          auVar37._24_4_ = 0x80000000;
          auVar37._28_4_ = 0x80000000;
          auVar123 = vxorps_avx512vl(auVar131,auVar37);
          auVar123 = vsubps_avx(auVar123,auVar122);
          auVar61._4_4_ = auVar123._4_4_ * auVar104._4_4_;
          auVar61._0_4_ = auVar123._0_4_ * auVar104._0_4_;
          auVar61._8_4_ = auVar123._8_4_ * auVar104._8_4_;
          auVar61._12_4_ = auVar123._12_4_ * auVar104._12_4_;
          auVar61._16_4_ = auVar123._16_4_ * 0.0;
          auVar61._20_4_ = auVar123._20_4_ * 0.0;
          auVar61._24_4_ = auVar123._24_4_ * 0.0;
          auVar61._28_4_ = 0x3e000000;
          auVar122 = vsubps_avx512vl(auVar122,auVar131);
          auVar62._4_4_ = auVar122._4_4_ * auVar104._4_4_;
          auVar62._0_4_ = auVar122._0_4_ * auVar104._0_4_;
          auVar62._8_4_ = auVar122._8_4_ * auVar104._8_4_;
          auVar62._12_4_ = auVar122._12_4_ * auVar104._12_4_;
          auVar62._16_4_ = auVar122._16_4_ * 0.0;
          auVar62._20_4_ = auVar122._20_4_ * 0.0;
          auVar62._24_4_ = auVar122._24_4_ * 0.0;
          auVar62._28_4_ = fVar196;
          auVar122 = vfmadd213ps_avx512vl(auVar133,auVar61,auVar115);
          auVar63._4_4_ = auVar118._4_4_ * auVar122._4_4_;
          auVar63._0_4_ = auVar118._0_4_ * auVar122._0_4_;
          auVar63._8_4_ = auVar118._8_4_ * auVar122._8_4_;
          auVar63._12_4_ = auVar118._12_4_ * auVar122._12_4_;
          auVar63._16_4_ = auVar118._16_4_ * auVar122._16_4_;
          auVar63._20_4_ = auVar118._20_4_ * auVar122._20_4_;
          auVar63._24_4_ = auVar118._24_4_ * auVar122._24_4_;
          auVar63._28_4_ = auVar123._28_4_;
          auVar122 = vmulps_avx512vl(auVar117,auVar61);
          auVar123 = vmulps_avx512vl(auVar157._0_32_,auVar61);
          auVar113 = vmulps_avx512vl(local_aa0,auVar61);
          auVar126 = vfmadd213ps_avx512vl(auVar119,auVar63,auVar116);
          auVar126 = vsubps_avx512vl(auVar122,auVar126);
          auVar122 = vfmadd213ps_avx512vl(auVar120,auVar63,auVar114);
          auVar112 = vsubps_avx512vl(auVar123,auVar122);
          auVar104 = vfmadd213ps_fma(auVar63,auVar128,auVar125);
          auVar123 = vsubps_avx(auVar113,ZEXT1632(auVar104));
          auVar115 = vfmadd213ps_avx512vl(auVar133,auVar62,auVar115);
          auVar118 = vmulps_avx512vl(auVar118,auVar115);
          auVar115 = vmulps_avx512vl(auVar117,auVar62);
          auVar113 = vmulps_avx512vl(auVar157._0_32_,auVar62);
          auVar127 = vmulps_avx512vl(local_aa0,auVar62);
          auVar104 = vfmadd213ps_fma(auVar119,auVar118,auVar116);
          auVar122 = vsubps_avx(auVar115,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar120,auVar118,auVar114);
          auVar115 = vsubps_avx512vl(auVar113,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar128,auVar118,auVar125);
          auVar118 = vsubps_avx512vl(auVar127,ZEXT1632(auVar104));
          auVar231._8_4_ = 0x7f800000;
          auVar231._0_8_ = 0x7f8000007f800000;
          auVar231._12_4_ = 0x7f800000;
          auVar231._16_4_ = 0x7f800000;
          auVar231._20_4_ = 0x7f800000;
          auVar231._24_4_ = 0x7f800000;
          auVar231._28_4_ = 0x7f800000;
          auVar119 = vblendmps_avx512vl(auVar231,auVar61);
          bVar7 = (bool)((byte)uVar100 & 1);
          auVar150._0_4_ = (uint)bVar7 * auVar119._0_4_ | (uint)!bVar7 * auVar116._0_4_;
          bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar7 * auVar119._4_4_ | (uint)!bVar7 * auVar116._4_4_;
          bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar7 * auVar119._8_4_ | (uint)!bVar7 * auVar116._8_4_;
          bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar7 * auVar119._12_4_ | (uint)!bVar7 * auVar116._12_4_;
          bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
          auVar150._16_4_ = (uint)bVar7 * auVar119._16_4_ | (uint)!bVar7 * auVar116._16_4_;
          bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
          auVar150._20_4_ = (uint)bVar7 * auVar119._20_4_ | (uint)!bVar7 * auVar116._20_4_;
          bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
          auVar150._24_4_ = (uint)bVar7 * auVar119._24_4_ | (uint)!bVar7 * auVar116._24_4_;
          bVar7 = SUB81(uVar100 >> 7,0);
          auVar150._28_4_ = (uint)bVar7 * auVar119._28_4_ | (uint)!bVar7 * auVar116._28_4_;
          auVar232._8_4_ = 0xff800000;
          auVar232._0_8_ = 0xff800000ff800000;
          auVar232._12_4_ = 0xff800000;
          auVar232._16_4_ = 0xff800000;
          auVar232._20_4_ = 0xff800000;
          auVar232._24_4_ = 0xff800000;
          auVar232._28_4_ = 0xff800000;
          auVar119 = vblendmps_avx512vl(auVar232,auVar62);
          bVar7 = (bool)((byte)uVar100 & 1);
          auVar151._0_4_ = (uint)bVar7 * auVar119._0_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar7 * auVar119._4_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar7 * auVar119._8_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar7 * auVar119._12_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
          auVar151._16_4_ = (uint)bVar7 * auVar119._16_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
          auVar151._20_4_ = (uint)bVar7 * auVar119._20_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
          auVar151._24_4_ = (uint)bVar7 * auVar119._24_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = SUB81(uVar100 >> 7,0);
          auVar151._28_4_ = (uint)bVar7 * auVar119._28_4_ | (uint)!bVar7 * -0x800000;
          auVar263._8_4_ = 0x7fffffff;
          auVar263._0_8_ = 0x7fffffff7fffffff;
          auVar263._12_4_ = 0x7fffffff;
          auVar263._16_4_ = 0x7fffffff;
          auVar263._20_4_ = 0x7fffffff;
          auVar263._24_4_ = 0x7fffffff;
          auVar263._28_4_ = 0x7fffffff;
          auVar119 = vandps_avx(auVar263,local_8e0);
          auVar119 = vmaxps_avx(local_7e0,auVar119);
          auVar38._8_4_ = 0x36000000;
          auVar38._0_8_ = 0x3600000036000000;
          auVar38._12_4_ = 0x36000000;
          auVar38._16_4_ = 0x36000000;
          auVar38._20_4_ = 0x36000000;
          auVar38._24_4_ = 0x36000000;
          auVar38._28_4_ = 0x36000000;
          auVar120 = vmulps_avx512vl(auVar119,auVar38);
          auVar119 = vandps_avx(auVar124,auVar263);
          uVar96 = vcmpps_avx512vl(auVar119,auVar120,1);
          uVar100 = uVar100 & uVar96;
          bVar91 = (byte)uVar100;
          if (bVar91 != 0) {
            uVar96 = vcmpps_avx512vl(auVar121,ZEXT1632(auVar105),2);
            auVar264._8_4_ = 0xff800000;
            auVar264._0_8_ = 0xff800000ff800000;
            auVar264._12_4_ = 0xff800000;
            auVar264._16_4_ = 0xff800000;
            auVar264._20_4_ = 0xff800000;
            auVar264._24_4_ = 0xff800000;
            auVar264._28_4_ = 0xff800000;
            auVar269._8_4_ = 0x7f800000;
            auVar269._0_8_ = 0x7f8000007f800000;
            auVar269._12_4_ = 0x7f800000;
            auVar269._16_4_ = 0x7f800000;
            auVar269._20_4_ = 0x7f800000;
            auVar269._24_4_ = 0x7f800000;
            auVar269._28_4_ = 0x7f800000;
            auVar119 = vblendmps_avx512vl(auVar269,auVar264);
            bVar94 = (byte)uVar96;
            uVar93 = (uint)(bVar94 & 1) * auVar119._0_4_ |
                     (uint)!(bool)(bVar94 & 1) * auVar120._0_4_;
            bVar7 = (bool)((byte)(uVar96 >> 1) & 1);
            uVar165 = (uint)bVar7 * auVar119._4_4_ | (uint)!bVar7 * auVar120._4_4_;
            bVar7 = (bool)((byte)(uVar96 >> 2) & 1);
            uVar166 = (uint)bVar7 * auVar119._8_4_ | (uint)!bVar7 * auVar120._8_4_;
            bVar7 = (bool)((byte)(uVar96 >> 3) & 1);
            uVar167 = (uint)bVar7 * auVar119._12_4_ | (uint)!bVar7 * auVar120._12_4_;
            bVar7 = (bool)((byte)(uVar96 >> 4) & 1);
            uVar168 = (uint)bVar7 * auVar119._16_4_ | (uint)!bVar7 * auVar120._16_4_;
            bVar7 = (bool)((byte)(uVar96 >> 5) & 1);
            uVar169 = (uint)bVar7 * auVar119._20_4_ | (uint)!bVar7 * auVar120._20_4_;
            bVar7 = (bool)((byte)(uVar96 >> 6) & 1);
            uVar170 = (uint)bVar7 * auVar119._24_4_ | (uint)!bVar7 * auVar120._24_4_;
            bVar7 = SUB81(uVar96 >> 7,0);
            uVar171 = (uint)bVar7 * auVar119._28_4_ | (uint)!bVar7 * auVar120._28_4_;
            auVar150._0_4_ = (bVar91 & 1) * uVar93 | !(bool)(bVar91 & 1) * auVar150._0_4_;
            bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar150._4_4_ = bVar7 * uVar165 | !bVar7 * auVar150._4_4_;
            bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar150._8_4_ = bVar7 * uVar166 | !bVar7 * auVar150._8_4_;
            bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar150._12_4_ = bVar7 * uVar167 | !bVar7 * auVar150._12_4_;
            bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar150._16_4_ = bVar7 * uVar168 | !bVar7 * auVar150._16_4_;
            bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar150._20_4_ = bVar7 * uVar169 | !bVar7 * auVar150._20_4_;
            bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar150._24_4_ = bVar7 * uVar170 | !bVar7 * auVar150._24_4_;
            bVar7 = SUB81(uVar100 >> 7,0);
            auVar150._28_4_ = bVar7 * uVar171 | !bVar7 * auVar150._28_4_;
            auVar119 = vblendmps_avx512vl(auVar264,auVar269);
            bVar7 = (bool)((byte)(uVar96 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar96 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar96 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar96 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar96 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar96 >> 6) & 1);
            bVar13 = SUB81(uVar96 >> 7,0);
            auVar151._0_4_ =
                 (uint)(bVar91 & 1) *
                 ((uint)(bVar94 & 1) * auVar119._0_4_ | !(bool)(bVar94 & 1) * uVar93) |
                 !(bool)(bVar91 & 1) * auVar151._0_4_;
            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar151._4_4_ =
                 (uint)bVar99 * ((uint)bVar7 * auVar119._4_4_ | !bVar7 * uVar165) |
                 !bVar99 * auVar151._4_4_;
            bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar151._8_4_ =
                 (uint)bVar7 * ((uint)bVar8 * auVar119._8_4_ | !bVar8 * uVar166) |
                 !bVar7 * auVar151._8_4_;
            bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar151._12_4_ =
                 (uint)bVar7 * ((uint)bVar9 * auVar119._12_4_ | !bVar9 * uVar167) |
                 !bVar7 * auVar151._12_4_;
            bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar151._16_4_ =
                 (uint)bVar7 * ((uint)bVar10 * auVar119._16_4_ | !bVar10 * uVar168) |
                 !bVar7 * auVar151._16_4_;
            bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar151._20_4_ =
                 (uint)bVar7 * ((uint)bVar11 * auVar119._20_4_ | !bVar11 * uVar169) |
                 !bVar7 * auVar151._20_4_;
            bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar151._24_4_ =
                 (uint)bVar7 * ((uint)bVar12 * auVar119._24_4_ | !bVar12 * uVar170) |
                 !bVar7 * auVar151._24_4_;
            bVar7 = SUB81(uVar100 >> 7,0);
            auVar151._28_4_ =
                 (uint)bVar7 * ((uint)bVar13 * auVar119._28_4_ | !bVar13 * uVar171) |
                 !bVar7 * auVar151._28_4_;
            bVar95 = (~bVar91 | bVar94) & bVar95;
          }
        }
        auVar267._8_4_ = 0x7fffffff;
        auVar267._0_8_ = 0x7fffffff7fffffff;
        auVar267._12_4_ = 0x7fffffff;
        auVar118 = vmulps_avx512vl(local_aa0,auVar118);
        auVar115 = vfmadd231ps_avx512vl(auVar118,auVar157._0_32_,auVar115);
        auVar193._0_32_ = vfmadd231ps_avx512vl(auVar115,auVar117,auVar122);
        _local_500 = _local_920;
        local_4e0 = vminps_avx(local_7a0,auVar150);
        auVar255._8_4_ = 0x7fffffff;
        auVar255._0_8_ = 0x7fffffff7fffffff;
        auVar255._12_4_ = 0x7fffffff;
        auVar255._16_4_ = 0x7fffffff;
        auVar255._20_4_ = 0x7fffffff;
        auVar255._24_4_ = 0x7fffffff;
        auVar255._28_4_ = 0x7fffffff;
        auVar115 = vandps_avx(auVar193._0_32_,auVar255);
        auVar249 = ZEXT3264(auVar115);
        _local_880 = vmaxps_avx(_local_920,auVar151);
        _local_7c0 = _local_880;
        auVar233._8_4_ = 0x3e99999a;
        auVar233._0_8_ = 0x3e99999a3e99999a;
        auVar233._12_4_ = 0x3e99999a;
        auVar233._16_4_ = 0x3e99999a;
        auVar233._20_4_ = 0x3e99999a;
        auVar233._24_4_ = 0x3e99999a;
        auVar233._28_4_ = 0x3e99999a;
        uVar23 = vcmpps_avx512vl(auVar115,auVar233,1);
        uVar25 = vcmpps_avx512vl(_local_920,local_4e0,2);
        bVar91 = (byte)uVar25 & bVar88;
        uVar24 = vcmpps_avx512vl(_local_880,local_7a0,2);
        if ((bVar88 & ((byte)uVar24 | (byte)uVar25)) == 0) {
          auVar242 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar115 = vmulps_avx512vl(local_aa0,auVar123);
          auVar115 = vfmadd213ps_avx512vl(auVar112,auVar157._0_32_,auVar115);
          auVar115 = vfmadd213ps_avx512vl(auVar126,auVar117,auVar115);
          auVar115 = vandps_avx(auVar115,auVar255);
          uVar25 = vcmpps_avx512vl(auVar115,auVar233,1);
          bVar94 = (byte)uVar25 | ~bVar95;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar115 = vpblendmd_avx512vl(auVar187,auVar39);
          local_780._0_4_ = (uint)(bVar94 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar94 & 1) * 2;
          bVar7 = (bool)(bVar94 >> 1 & 1);
          local_780._4_4_ = (uint)bVar7 * auVar115._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar94 >> 2 & 1);
          local_780._8_4_ = (uint)bVar7 * auVar115._8_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar94 >> 3 & 1);
          local_780._12_4_ = (uint)bVar7 * auVar115._12_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar94 >> 4 & 1);
          local_780._16_4_ = (uint)bVar7 * auVar115._16_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar94 >> 5 & 1);
          local_780._20_4_ = (uint)bVar7 * auVar115._20_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar94 >> 6 & 1);
          local_780._24_4_ = (uint)bVar7 * auVar115._24_4_ | (uint)!bVar7 * 2;
          local_780._28_4_ = (uint)(bVar94 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar94 >> 7) * 2;
          auVar161._0_32_ = vpbroadcastd_avx512vl();
          auVar161._32_32_ = auVar193._32_32_;
          local_800 = auVar161._0_32_;
          uVar25 = vpcmpd_avx512vl(auVar161._0_32_,local_780,5);
          bVar94 = (byte)uVar25 & bVar91;
          if (bVar94 != 0) {
            auVar105 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar104 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar101 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar106 = vminps_avx(auVar105,auVar101);
            auVar105 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar101 = vmaxps_avx(auVar104,auVar105);
            auVar104 = vandps_avx(auVar267,auVar106);
            auVar105 = vandps_avx(auVar267,auVar101);
            auVar104 = vmaxps_avx(auVar104,auVar105);
            auVar105 = vmovshdup_avx(auVar104);
            auVar105 = vmaxss_avx(auVar105,auVar104);
            auVar104 = vshufpd_avx(auVar104,auVar104,1);
            auVar104 = vmaxss_avx(auVar104,auVar105);
            fVar172 = auVar104._0_4_ * 1.9073486e-06;
            local_a10 = vshufps_avx(auVar101,auVar101,0xff);
            local_860 = (float)local_920._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_920._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_918 + fStack_8f8;
            fStack_854 = fStack_914 + fStack_8f4;
            fStack_850 = fStack_910 + fStack_8f0;
            fStack_84c = fStack_90c + fStack_8ec;
            fStack_848 = fStack_908 + fStack_8e8;
            fStack_844 = fStack_904 + fStack_8e4;
            do {
              auVar188._8_4_ = 0x7f800000;
              auVar188._0_8_ = 0x7f8000007f800000;
              auVar188._12_4_ = 0x7f800000;
              auVar188._16_4_ = 0x7f800000;
              auVar188._20_4_ = 0x7f800000;
              auVar188._24_4_ = 0x7f800000;
              auVar188._28_4_ = 0x7f800000;
              auVar115 = vblendmps_avx512vl(auVar188,_local_920);
              auVar152._0_4_ =
                   (uint)(bVar94 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar94 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar94 >> 1 & 1);
              auVar152._4_4_ = (uint)bVar7 * auVar115._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar94 >> 2 & 1);
              auVar152._8_4_ = (uint)bVar7 * auVar115._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar94 >> 3 & 1);
              auVar152._12_4_ = (uint)bVar7 * auVar115._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar94 >> 4 & 1);
              auVar152._16_4_ = (uint)bVar7 * auVar115._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar94 >> 5 & 1);
              auVar152._20_4_ = (uint)bVar7 * auVar115._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar152._24_4_ =
                   (uint)(bVar94 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar94 >> 6) * 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar161._0_32_ = auVar152;
              auVar115 = vshufps_avx(auVar152,auVar152,0xb1);
              auVar115 = vminps_avx(auVar152,auVar115);
              auVar118 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar118);
              auVar118 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar118);
              uVar25 = vcmpps_avx512vl(auVar152,auVar115,0);
              bVar89 = (byte)uVar25 & bVar94;
              bVar90 = bVar94;
              if (bVar89 != 0) {
                bVar90 = bVar89;
              }
              iVar26 = 0;
              for (uVar93 = (uint)bVar90; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                iVar26 = iVar26 + 1;
              }
              fVar256 = *(float *)(local_820 + (uint)(iVar26 << 2));
              fVar257 = *(float *)(local_500 + (uint)(iVar26 << 2));
              fVar259 = auVar21._0_4_;
              if ((float)local_a30._0_4_ < 0.0) {
                fVar259 = sqrtf((float)local_a30._0_4_);
              }
              lVar98 = 4;
              do {
                auVar173._4_4_ = fVar257;
                auVar173._0_4_ = fVar257;
                auVar173._8_4_ = fVar257;
                auVar173._12_4_ = fVar257;
                auVar105 = vfmadd132ps_fma(auVar173,ZEXT816(0) << 0x40,local_a20);
                fVar266 = 1.0 - fVar256;
                auVar219._0_4_ = local_980._0_4_ * fVar256;
                auVar219._4_4_ = local_980._4_4_ * fVar256;
                auVar219._8_4_ = local_980._8_4_ * fVar256;
                auVar219._12_4_ = local_980._12_4_ * fVar256;
                local_9b0 = ZEXT416((uint)fVar266);
                auVar239._4_4_ = fVar266;
                auVar239._0_4_ = fVar266;
                auVar239._8_4_ = fVar266;
                auVar239._12_4_ = fVar266;
                auVar104 = vfmadd231ps_fma(auVar219,auVar239,local_940._0_16_);
                auVar243._0_4_ = local_960._0_4_ * fVar256;
                auVar243._4_4_ = local_960._4_4_ * fVar256;
                auVar243._8_4_ = local_960._8_4_ * fVar256;
                auVar243._12_4_ = local_960._12_4_ * fVar256;
                auVar101 = vfmadd231ps_fma(auVar243,auVar239,local_980._0_16_);
                auVar250._0_4_ = fVar256 * (float)local_9a0._0_4_;
                auVar250._4_4_ = fVar256 * (float)local_9a0._4_4_;
                auVar250._8_4_ = fVar256 * fStack_998;
                auVar250._12_4_ = fVar256 * fStack_994;
                auVar106 = vfmadd231ps_fma(auVar250,auVar239,local_960._0_16_);
                auVar253._0_4_ = fVar256 * auVar101._0_4_;
                auVar253._4_4_ = fVar256 * auVar101._4_4_;
                auVar253._8_4_ = fVar256 * auVar101._8_4_;
                auVar253._12_4_ = fVar256 * auVar101._12_4_;
                auVar104 = vfmadd231ps_fma(auVar253,auVar239,auVar104);
                auVar220._0_4_ = fVar256 * auVar106._0_4_;
                auVar220._4_4_ = fVar256 * auVar106._4_4_;
                auVar220._8_4_ = fVar256 * auVar106._8_4_;
                auVar220._12_4_ = fVar256 * auVar106._12_4_;
                auVar101 = vfmadd231ps_fma(auVar220,auVar239,auVar101);
                auVar244._0_4_ = fVar256 * auVar101._0_4_;
                auVar244._4_4_ = fVar256 * auVar101._4_4_;
                auVar244._8_4_ = fVar256 * auVar101._8_4_;
                auVar244._12_4_ = fVar256 * auVar101._12_4_;
                auVar106 = vfmadd231ps_fma(auVar244,auVar104,auVar239);
                auVar104 = vsubps_avx(auVar101,auVar104);
                auVar27._8_4_ = 0x40400000;
                auVar27._0_8_ = 0x4040000040400000;
                auVar27._12_4_ = 0x40400000;
                auVar115 = auVar161._32_32_;
                auVar101 = vmulps_avx512vl(auVar104,auVar27);
                local_8e0._0_16_ = auVar106;
                auVar104 = vsubps_avx(auVar105,auVar106);
                local_a60._0_16_ = auVar104;
                auVar104 = vdpps_avx(auVar104,auVar104,0x7f);
                local_a80._0_16_ = auVar104;
                local_bc0 = ZEXT416((uint)fVar256);
                if (auVar104._0_4_ < 0.0) {
                  auVar249._0_4_ = sqrtf(auVar104._0_4_);
                  auVar249._4_60_ = extraout_var;
                  auVar104 = auVar249._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                }
                local_9c0 = vdpps_avx(auVar101,auVar101,0x7f);
                fVar266 = local_9c0._0_4_;
                auVar221._4_12_ = ZEXT812(0) << 0x20;
                auVar221._0_4_ = fVar266;
                auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar221);
                fVar196 = auVar105._0_4_;
                local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar221);
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar106 = vxorps_avx512vl(local_9c0,auVar28);
                auVar105 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
                uVar93 = auVar104._0_4_;
                if (fVar266 < auVar106._0_4_) {
                  auVar272._0_4_ = sqrtf(fVar266);
                  auVar272._4_60_ = extraout_var_00;
                  auVar104 = ZEXT416(uVar93);
                  auVar106 = auVar272._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx512f(local_9c0,local_9c0);
                }
                fVar266 = fVar196 * 1.5 + fVar266 * -0.5 * fVar196 * fVar196 * fVar196;
                auVar174._0_4_ = auVar101._0_4_ * fVar266;
                auVar174._4_4_ = auVar101._4_4_ * fVar266;
                auVar174._8_4_ = auVar101._8_4_ * fVar266;
                auVar174._12_4_ = auVar101._12_4_ * fVar266;
                auVar1 = vdpps_avx(local_a60._0_16_,auVar174,0x7f);
                fVar236 = auVar104._0_4_;
                fVar196 = auVar1._0_4_;
                auVar175._0_4_ = fVar196 * fVar196;
                auVar175._4_4_ = auVar1._4_4_ * auVar1._4_4_;
                auVar175._8_4_ = auVar1._8_4_ * auVar1._8_4_;
                auVar175._12_4_ = auVar1._12_4_ * auVar1._12_4_;
                auVar107 = vsubps_avx512vl(local_a80._0_16_,auVar175);
                fVar261 = auVar107._0_4_;
                auVar198._4_12_ = ZEXT812(0) << 0x20;
                auVar198._0_4_ = fVar261;
                auVar102 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
                auVar108 = vmulss_avx512f(auVar102,ZEXT416(0x3fc00000));
                auVar109 = vmulss_avx512f(auVar107,ZEXT416(0xbf000000));
                if (fVar261 < 0.0) {
                  local_9f0 = fVar266;
                  fStack_9ec = fVar266;
                  fStack_9e8 = fVar266;
                  fStack_9e4 = fVar266;
                  local_9e0 = auVar102;
                  fVar261 = sqrtf(fVar261);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar108 = ZEXT416(auVar108._0_4_);
                  auVar106 = ZEXT416(auVar106._0_4_);
                  auVar104 = ZEXT416(uVar93);
                  auVar102 = local_9e0;
                  fVar266 = local_9f0;
                  fVar262 = fStack_9ec;
                  fVar258 = fStack_9e8;
                  fVar260 = fStack_9e4;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  fVar261 = auVar107._0_4_;
                  fVar262 = fVar266;
                  fVar258 = fVar266;
                  fVar260 = fVar266;
                }
                auVar267._8_4_ = 0x7fffffff;
                auVar267._0_8_ = 0x7fffffff7fffffff;
                auVar267._12_4_ = 0x7fffffff;
                auVar158._32_32_ = auVar115;
                auVar158._0_32_ = local_aa0;
                auVar272 = ZEXT3264(local_aa0);
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9b0);
                fVar197 = auVar107._0_4_ * 6.0;
                fVar22 = fVar256 * 6.0;
                auVar222._0_4_ = fVar22 * (float)local_9a0._0_4_;
                auVar222._4_4_ = fVar22 * (float)local_9a0._4_4_;
                auVar222._8_4_ = fVar22 * fStack_998;
                auVar222._12_4_ = fVar22 * fStack_994;
                auVar199._4_4_ = fVar197;
                auVar199._0_4_ = fVar197;
                auVar199._8_4_ = fVar197;
                auVar199._12_4_ = fVar197;
                auVar107 = vfmadd132ps_fma(auVar199,auVar222,local_960._0_16_);
                auVar111 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9b0,local_bc0);
                fVar197 = auVar111._0_4_ * 6.0;
                auVar223._4_4_ = fVar197;
                auVar223._0_4_ = fVar197;
                auVar223._8_4_ = fVar197;
                auVar223._12_4_ = fVar197;
                auVar107 = vfmadd132ps_fma(auVar223,auVar107,local_980._0_16_);
                fVar197 = local_9b0._0_4_ * 6.0;
                auVar200._4_4_ = fVar197;
                auVar200._0_4_ = fVar197;
                auVar200._8_4_ = fVar197;
                auVar200._12_4_ = fVar197;
                auVar107 = vfmadd132ps_fma(auVar200,auVar107,local_940._0_16_);
                auVar224._0_4_ = auVar107._0_4_ * (float)local_9c0._0_4_;
                auVar224._4_4_ = auVar107._4_4_ * (float)local_9c0._0_4_;
                auVar224._8_4_ = auVar107._8_4_ * (float)local_9c0._0_4_;
                auVar224._12_4_ = auVar107._12_4_ * (float)local_9c0._0_4_;
                auVar107 = vdpps_avx(auVar101,auVar107,0x7f);
                fVar197 = auVar107._0_4_;
                auVar201._0_4_ = auVar101._0_4_ * fVar197;
                auVar201._4_4_ = auVar101._4_4_ * fVar197;
                auVar201._8_4_ = auVar101._8_4_ * fVar197;
                auVar201._12_4_ = auVar101._12_4_ * fVar197;
                auVar107 = vsubps_avx(auVar224,auVar201);
                fVar197 = auVar105._0_4_ * (float)local_9d0._0_4_;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar161._16_48_ = auVar158._16_48_;
                auVar110 = vxorps_avx512vl(auVar101,auVar29);
                auVar245._0_4_ = fVar266 * auVar107._0_4_ * fVar197;
                auVar245._4_4_ = fVar262 * auVar107._4_4_ * fVar197;
                auVar245._8_4_ = fVar258 * auVar107._8_4_ * fVar197;
                auVar245._12_4_ = fVar260 * auVar107._12_4_ * fVar197;
                auVar105 = vdpps_avx(auVar110,auVar174,0x7f);
                auVar107 = vmaxss_avx(ZEXT416((uint)fVar172),
                                      ZEXT416((uint)(fVar257 * fVar259 * 1.9073486e-06)));
                auVar111 = vdivss_avx512f(ZEXT416((uint)fVar172),auVar106);
                auVar106 = vdpps_avx(local_a60._0_16_,auVar245,0x7f);
                auVar104 = vfmadd213ss_fma(auVar104,ZEXT416((uint)fVar172),auVar107);
                auVar111 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 + 1.0)),auVar111,auVar104);
                auVar104 = vdpps_avx(local_a20,auVar174,0x7f);
                fVar266 = auVar105._0_4_ + auVar106._0_4_;
                auVar105 = vdpps_avx(local_a60._0_16_,auVar110,0x7f);
                auVar109 = vmulss_avx512f(auVar109,auVar102);
                auVar102 = vmulss_avx512f(auVar102,auVar102);
                auVar106 = vdpps_avx(local_a60._0_16_,local_a20,0x7f);
                auVar161._0_16_ =
                     vaddss_avx512f(auVar108,ZEXT416((uint)(auVar109._0_4_ * auVar102._0_4_)));
                auVar102 = vfnmadd231ss_fma(auVar105,auVar1,ZEXT416((uint)fVar266));
                auVar108 = vfnmadd231ss_fma(auVar106,auVar1,auVar104);
                auVar105 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar261 = fVar261 - auVar105._0_4_;
                auVar105 = vshufps_avx(auVar101,auVar101,0xff);
                auVar106 = vfmsub213ss_fma(auVar102,auVar161._0_16_,auVar105);
                fVar236 = auVar108._0_4_ * auVar161._0_4_;
                auVar102 = vfmsub231ss_fma(ZEXT416((uint)(auVar104._0_4_ * auVar106._0_4_)),
                                           ZEXT416((uint)fVar266),ZEXT416((uint)fVar236));
                fVar262 = auVar102._0_4_;
                fVar266 = fVar261 * (fVar266 / fVar262) - fVar196 * (auVar106._0_4_ / fVar262);
                auVar249 = ZEXT464((uint)fVar266);
                fVar256 = fVar256 - (fVar196 * (fVar236 / fVar262) -
                                    fVar261 * (auVar104._0_4_ / fVar262));
                fVar257 = fVar257 - fVar266;
                auVar104 = vandps_avx(auVar1,auVar267);
                if (auVar111._0_4_ <= auVar104._0_4_) {
LAB_01dee44d:
                  bVar7 = false;
                }
                else {
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar111._0_4_ + auVar107._0_4_)),
                                             local_a10,ZEXT416(0x36000000));
                  auVar104 = vandps_avx(auVar267,ZEXT416((uint)fVar261));
                  if (auVar106._0_4_ <= auVar104._0_4_) goto LAB_01dee44d;
                  fVar257 = fVar257 + (float)local_a00._0_4_;
                  bVar7 = true;
                  if (fVar237 <= fVar257) {
                    fVar266 = *(float *)(ray + k * 4 + 0x200);
                    auVar249 = ZEXT464((uint)fVar266);
                    if (((fVar257 <= fVar266) && (0.0 <= fVar256)) && (fVar256 <= 1.0)) {
                      auVar160._16_48_ = auVar161._16_48_;
                      auVar160._0_16_ = ZEXT816(0) << 0x20;
                      auVar159._4_60_ = auVar160._4_60_;
                      auVar159._0_4_ = local_a80._0_4_;
                      auVar104 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar159._0_16_);
                      fVar196 = auVar104._0_4_;
                      auVar161._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar97].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        fVar196 = fVar196 * 1.5 + auVar161._0_4_ * fVar196 * fVar196 * fVar196;
                        auVar202._0_4_ = local_a60._0_4_ * fVar196;
                        auVar202._4_4_ = local_a60._4_4_ * fVar196;
                        auVar202._8_4_ = local_a60._8_4_ * fVar196;
                        auVar202._12_4_ = local_a60._12_4_ * fVar196;
                        auVar106 = vfmadd213ps_fma(auVar105,auVar202,auVar101);
                        auVar104 = vshufps_avx(auVar202,auVar202,0xc9);
                        auVar105 = vshufps_avx(auVar101,auVar101,0xc9);
                        auVar203._0_4_ = auVar202._0_4_ * auVar105._0_4_;
                        auVar203._4_4_ = auVar202._4_4_ * auVar105._4_4_;
                        auVar203._8_4_ = auVar202._8_4_ * auVar105._8_4_;
                        auVar203._12_4_ = auVar202._12_4_ * auVar105._12_4_;
                        auVar101 = vfmsub231ps_fma(auVar203,auVar101,auVar104);
                        auVar104 = vshufps_avx(auVar101,auVar101,0xc9);
                        auVar105 = vshufps_avx(auVar106,auVar106,0xc9);
                        auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                        auVar176._0_4_ = auVar106._0_4_ * auVar101._0_4_;
                        auVar176._4_4_ = auVar106._4_4_ * auVar101._4_4_;
                        auVar176._8_4_ = auVar106._8_4_ * auVar101._8_4_;
                        auVar176._12_4_ = auVar106._12_4_ * auVar101._12_4_;
                        auVar104 = vfmsub231ps_fma(auVar176,auVar104,auVar105);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x200) = fVar257;
                          uVar238 = vextractps_avx(auVar104,1);
                          *(undefined4 *)(ray + k * 4 + 0x300) = uVar238;
                          uVar238 = vextractps_avx(auVar104,2);
                          *(undefined4 *)(ray + k * 4 + 0x340) = uVar238;
                          *(int *)(ray + k * 4 + 0x380) = auVar104._0_4_;
                          *(float *)(ray + k * 4 + 0x3c0) = fVar256;
                          *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                          *(uint *)(ray + k * 4 + 0x440) = uVar3;
                          *(uint *)(ray + k * 4 + 0x480) = uVar97;
                          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar6 = context->user;
                          local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar256));
                          auVar193 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar193 = vpermps_avx512f(auVar193,ZEXT1664(auVar104));
                          auVar156 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar156,ZEXT1664(auVar104));
                          local_380 = vbroadcastss_avx512f(auVar104);
                          local_400[0] = (RTCHitN)auVar193[0];
                          local_400[1] = (RTCHitN)auVar193[1];
                          local_400[2] = (RTCHitN)auVar193[2];
                          local_400[3] = (RTCHitN)auVar193[3];
                          local_400[4] = (RTCHitN)auVar193[4];
                          local_400[5] = (RTCHitN)auVar193[5];
                          local_400[6] = (RTCHitN)auVar193[6];
                          local_400[7] = (RTCHitN)auVar193[7];
                          local_400[8] = (RTCHitN)auVar193[8];
                          local_400[9] = (RTCHitN)auVar193[9];
                          local_400[10] = (RTCHitN)auVar193[10];
                          local_400[0xb] = (RTCHitN)auVar193[0xb];
                          local_400[0xc] = (RTCHitN)auVar193[0xc];
                          local_400[0xd] = (RTCHitN)auVar193[0xd];
                          local_400[0xe] = (RTCHitN)auVar193[0xe];
                          local_400[0xf] = (RTCHitN)auVar193[0xf];
                          local_400[0x10] = (RTCHitN)auVar193[0x10];
                          local_400[0x11] = (RTCHitN)auVar193[0x11];
                          local_400[0x12] = (RTCHitN)auVar193[0x12];
                          local_400[0x13] = (RTCHitN)auVar193[0x13];
                          local_400[0x14] = (RTCHitN)auVar193[0x14];
                          local_400[0x15] = (RTCHitN)auVar193[0x15];
                          local_400[0x16] = (RTCHitN)auVar193[0x16];
                          local_400[0x17] = (RTCHitN)auVar193[0x17];
                          local_400[0x18] = (RTCHitN)auVar193[0x18];
                          local_400[0x19] = (RTCHitN)auVar193[0x19];
                          local_400[0x1a] = (RTCHitN)auVar193[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar193[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar193[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar193[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar193[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar193[0x1f];
                          local_400[0x20] = (RTCHitN)auVar193[0x20];
                          local_400[0x21] = (RTCHitN)auVar193[0x21];
                          local_400[0x22] = (RTCHitN)auVar193[0x22];
                          local_400[0x23] = (RTCHitN)auVar193[0x23];
                          local_400[0x24] = (RTCHitN)auVar193[0x24];
                          local_400[0x25] = (RTCHitN)auVar193[0x25];
                          local_400[0x26] = (RTCHitN)auVar193[0x26];
                          local_400[0x27] = (RTCHitN)auVar193[0x27];
                          local_400[0x28] = (RTCHitN)auVar193[0x28];
                          local_400[0x29] = (RTCHitN)auVar193[0x29];
                          local_400[0x2a] = (RTCHitN)auVar193[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar193[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar193[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar193[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar193[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar193[0x2f];
                          local_400[0x30] = (RTCHitN)auVar193[0x30];
                          local_400[0x31] = (RTCHitN)auVar193[0x31];
                          local_400[0x32] = (RTCHitN)auVar193[0x32];
                          local_400[0x33] = (RTCHitN)auVar193[0x33];
                          local_400[0x34] = (RTCHitN)auVar193[0x34];
                          local_400[0x35] = (RTCHitN)auVar193[0x35];
                          local_400[0x36] = (RTCHitN)auVar193[0x36];
                          local_400[0x37] = (RTCHitN)auVar193[0x37];
                          local_400[0x38] = (RTCHitN)auVar193[0x38];
                          local_400[0x39] = (RTCHitN)auVar193[0x39];
                          local_400[0x3a] = (RTCHitN)auVar193[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar193[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar193[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar193[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar193[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar193[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_480._0_8_;
                          uStack_2b8 = local_480._8_8_;
                          uStack_2b0 = local_480._16_8_;
                          uStack_2a8 = local_480._24_8_;
                          uStack_2a0 = local_480._32_8_;
                          uStack_298 = local_480._40_8_;
                          uStack_290 = local_480._48_8_;
                          uStack_288 = local_480._56_8_;
                          auVar193 = vmovdqa64_avx512f(local_440);
                          local_280 = vmovdqa64_avx512f(auVar193);
                          auVar115 = vpcmpeqd_avx2(auVar193._0_32_,auVar193._0_32_);
                          local_ac8[3] = auVar115;
                          local_ac8[2] = auVar115;
                          local_ac8[1] = auVar115;
                          *local_ac8 = auVar115;
                          local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar257;
                          local_8c0 = local_4c0;
                          local_b10.valid = (int *)local_8c0;
                          local_b10.geometryUserPtr = pGVar4->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->intersectionFilterN)(&local_b10);
                            auVar272 = ZEXT3264(local_aa0);
                            auVar267._8_4_ = 0x7fffffff;
                            auVar267._0_8_ = 0x7fffffff7fffffff;
                            auVar267._12_4_ = 0x7fffffff;
                          }
                          auVar161 = vmovdqa64_avx512f(local_8c0);
                          uVar25 = vptestmd_avx512f(auVar161,auVar161);
                          if ((short)uVar25 == 0) {
LAB_01dee72c:
                            *(float *)(ray + k * 4 + 0x200) = fVar266;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&local_b10);
                              auVar272 = ZEXT3264(local_aa0);
                              auVar267._8_4_ = 0x7fffffff;
                              auVar267._0_8_ = 0x7fffffff7fffffff;
                              auVar267._12_4_ = 0x7fffffff;
                            }
                            auVar161 = vmovdqa64_avx512f(local_8c0);
                            uVar100 = vptestmd_avx512f(auVar161,auVar161);
                            if ((short)uVar100 == 0) goto LAB_01dee72c;
                            iVar67 = *(int *)(local_b10.hit + 4);
                            iVar68 = *(int *)(local_b10.hit + 8);
                            iVar69 = *(int *)(local_b10.hit + 0xc);
                            iVar70 = *(int *)(local_b10.hit + 0x10);
                            iVar71 = *(int *)(local_b10.hit + 0x14);
                            iVar72 = *(int *)(local_b10.hit + 0x18);
                            iVar73 = *(int *)(local_b10.hit + 0x1c);
                            iVar74 = *(int *)(local_b10.hit + 0x20);
                            iVar75 = *(int *)(local_b10.hit + 0x24);
                            iVar76 = *(int *)(local_b10.hit + 0x28);
                            iVar77 = *(int *)(local_b10.hit + 0x2c);
                            iVar78 = *(int *)(local_b10.hit + 0x30);
                            iVar79 = *(int *)(local_b10.hit + 0x34);
                            iVar80 = *(int *)(local_b10.hit + 0x38);
                            iVar81 = *(int *)(local_b10.hit + 0x3c);
                            bVar90 = (byte)uVar100;
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar89 = (byte)(uVar100 >> 8);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar90 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x33c);
                            iVar67 = *(int *)(local_b10.hit + 0x44);
                            iVar68 = *(int *)(local_b10.hit + 0x48);
                            iVar69 = *(int *)(local_b10.hit + 0x4c);
                            iVar70 = *(int *)(local_b10.hit + 0x50);
                            iVar71 = *(int *)(local_b10.hit + 0x54);
                            iVar72 = *(int *)(local_b10.hit + 0x58);
                            iVar73 = *(int *)(local_b10.hit + 0x5c);
                            iVar74 = *(int *)(local_b10.hit + 0x60);
                            iVar75 = *(int *)(local_b10.hit + 100);
                            iVar76 = *(int *)(local_b10.hit + 0x68);
                            iVar77 = *(int *)(local_b10.hit + 0x6c);
                            iVar78 = *(int *)(local_b10.hit + 0x70);
                            iVar79 = *(int *)(local_b10.hit + 0x74);
                            iVar80 = *(int *)(local_b10.hit + 0x78);
                            iVar81 = *(int *)(local_b10.hit + 0x7c);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x37c);
                            iVar67 = *(int *)(local_b10.hit + 0x84);
                            iVar68 = *(int *)(local_b10.hit + 0x88);
                            iVar69 = *(int *)(local_b10.hit + 0x8c);
                            iVar70 = *(int *)(local_b10.hit + 0x90);
                            iVar71 = *(int *)(local_b10.hit + 0x94);
                            iVar72 = *(int *)(local_b10.hit + 0x98);
                            iVar73 = *(int *)(local_b10.hit + 0x9c);
                            iVar74 = *(int *)(local_b10.hit + 0xa0);
                            iVar75 = *(int *)(local_b10.hit + 0xa4);
                            iVar76 = *(int *)(local_b10.hit + 0xa8);
                            iVar77 = *(int *)(local_b10.hit + 0xac);
                            iVar78 = *(int *)(local_b10.hit + 0xb0);
                            iVar79 = *(int *)(local_b10.hit + 0xb4);
                            iVar80 = *(int *)(local_b10.hit + 0xb8);
                            iVar81 = *(int *)(local_b10.hit + 0xbc);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3bc);
                            iVar67 = *(int *)(local_b10.hit + 0xc4);
                            iVar68 = *(int *)(local_b10.hit + 200);
                            iVar69 = *(int *)(local_b10.hit + 0xcc);
                            iVar70 = *(int *)(local_b10.hit + 0xd0);
                            iVar71 = *(int *)(local_b10.hit + 0xd4);
                            iVar72 = *(int *)(local_b10.hit + 0xd8);
                            iVar73 = *(int *)(local_b10.hit + 0xdc);
                            iVar74 = *(int *)(local_b10.hit + 0xe0);
                            iVar75 = *(int *)(local_b10.hit + 0xe4);
                            iVar76 = *(int *)(local_b10.hit + 0xe8);
                            iVar77 = *(int *)(local_b10.hit + 0xec);
                            iVar78 = *(int *)(local_b10.hit + 0xf0);
                            iVar79 = *(int *)(local_b10.hit + 0xf4);
                            iVar80 = *(int *)(local_b10.hit + 0xf8);
                            iVar81 = *(int *)(local_b10.hit + 0xfc);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3fc);
                            iVar67 = *(int *)(local_b10.hit + 0x104);
                            iVar68 = *(int *)(local_b10.hit + 0x108);
                            iVar69 = *(int *)(local_b10.hit + 0x10c);
                            iVar70 = *(int *)(local_b10.hit + 0x110);
                            iVar71 = *(int *)(local_b10.hit + 0x114);
                            iVar72 = *(int *)(local_b10.hit + 0x118);
                            iVar73 = *(int *)(local_b10.hit + 0x11c);
                            iVar74 = *(int *)(local_b10.hit + 0x120);
                            iVar75 = *(int *)(local_b10.hit + 0x124);
                            iVar76 = *(int *)(local_b10.hit + 0x128);
                            iVar77 = *(int *)(local_b10.hit + 300);
                            iVar78 = *(int *)(local_b10.hit + 0x130);
                            iVar79 = *(int *)(local_b10.hit + 0x134);
                            iVar80 = *(int *)(local_b10.hit + 0x138);
                            iVar81 = *(int *)(local_b10.hit + 0x13c);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar90 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar89 & 1) * iVar74 |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x43c);
                            auVar193 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar193 = vmovdqu32_avx512f(auVar193);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar193;
                            auVar193 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar193 = vmovdqu32_avx512f(auVar193);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar193;
                            auVar156 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar193 = vmovdqa32_avx512f(auVar156);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar193;
                            auVar193 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            auVar64._4_56_ = auVar193._8_56_;
                            auVar64._0_4_ =
                                 (uint)bVar99 * auVar193._4_4_ | (uint)!bVar99 * auVar156._4_4_;
                            auVar161._0_8_ = auVar64._0_8_ << 0x20;
                            bVar99 = (bool)((byte)(uVar100 >> 2) & 1);
                            auVar161._8_4_ =
                                 (uint)bVar99 * auVar193._8_4_ | (uint)!bVar99 * auVar156._8_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 3) & 1);
                            auVar161._12_4_ =
                                 (uint)bVar99 * auVar193._12_4_ | (uint)!bVar99 * auVar156._12_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 4) & 1);
                            auVar161._16_4_ =
                                 (uint)bVar99 * auVar193._16_4_ | (uint)!bVar99 * auVar156._16_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 5) & 1);
                            auVar161._20_4_ =
                                 (uint)bVar99 * auVar193._20_4_ | (uint)!bVar99 * auVar156._20_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 6) & 1);
                            auVar161._24_4_ =
                                 (uint)bVar99 * auVar193._24_4_ | (uint)!bVar99 * auVar156._24_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 7) & 1);
                            auVar161._28_4_ =
                                 (uint)bVar99 * auVar193._28_4_ | (uint)!bVar99 * auVar156._28_4_;
                            auVar161._32_4_ =
                                 (uint)(bVar89 & 1) * auVar193._32_4_ |
                                 (uint)!(bool)(bVar89 & 1) * auVar156._32_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 9) & 1);
                            auVar161._36_4_ =
                                 (uint)bVar99 * auVar193._36_4_ | (uint)!bVar99 * auVar156._36_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 10) & 1);
                            auVar161._40_4_ =
                                 (uint)bVar99 * auVar193._40_4_ | (uint)!bVar99 * auVar156._40_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            auVar161._44_4_ =
                                 (uint)bVar99 * auVar193._44_4_ | (uint)!bVar99 * auVar156._44_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            auVar161._48_4_ =
                                 (uint)bVar99 * auVar193._48_4_ | (uint)!bVar99 * auVar156._48_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            auVar161._52_4_ =
                                 (uint)bVar99 * auVar193._52_4_ | (uint)!bVar99 * auVar156._52_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            auVar161._56_4_ =
                                 (uint)bVar99 * auVar193._56_4_ | (uint)!bVar99 * auVar156._56_4_;
                            bVar99 = SUB81(uVar100 >> 0xf,0);
                            auVar161._60_4_ =
                                 (uint)bVar99 * auVar193._60_4_ | (uint)!bVar99 * auVar156._60_4_;
                            auVar193 = vmovdqa32_avx512f(auVar193);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar193;
                          }
                          auVar249 = ZEXT464((uint)fVar266);
                        }
                      }
                    }
                  }
                }
                auVar193._32_32_ = auVar161._32_32_;
                bVar99 = lVar98 != 0;
                lVar98 = lVar98 + -1;
              } while ((!bVar7) && (bVar99));
              auVar82._4_4_ = fStack_85c;
              auVar82._0_4_ = local_860;
              auVar82._8_4_ = fStack_858;
              auVar82._12_4_ = fStack_854;
              auVar82._16_4_ = fStack_850;
              auVar82._20_4_ = fStack_84c;
              auVar82._24_4_ = fStack_848;
              auVar82._28_4_ = fStack_844;
              uVar238 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar40._4_4_ = uVar238;
              auVar40._0_4_ = uVar238;
              auVar40._8_4_ = uVar238;
              auVar40._12_4_ = uVar238;
              auVar40._16_4_ = uVar238;
              auVar40._20_4_ = uVar238;
              auVar40._24_4_ = uVar238;
              auVar40._28_4_ = uVar238;
              uVar25 = vcmpps_avx512vl(auVar82,auVar40,2);
              bVar94 = ~('\x01' << ((byte)iVar26 & 0x1f)) & bVar94 & (byte)uVar25;
            } while (bVar94 != 0);
          }
          auVar189._0_4_ = (float)local_880._0_4_ + (float)local_900._0_4_;
          auVar189._4_4_ = (float)local_880._4_4_ + (float)local_900._4_4_;
          auVar189._8_4_ = fStack_878 + fStack_8f8;
          auVar189._12_4_ = fStack_874 + fStack_8f4;
          auVar189._16_4_ = fStack_870 + fStack_8f0;
          auVar189._20_4_ = fStack_86c + fStack_8ec;
          auVar189._24_4_ = fStack_868 + fStack_8e8;
          auVar189._28_4_ = fStack_864 + fStack_8e4;
          uVar238 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar41._4_4_ = uVar238;
          auVar41._0_4_ = uVar238;
          auVar41._8_4_ = uVar238;
          auVar41._12_4_ = uVar238;
          auVar41._16_4_ = uVar238;
          auVar41._20_4_ = uVar238;
          auVar41._24_4_ = uVar238;
          auVar41._28_4_ = uVar238;
          uVar25 = vcmpps_avx512vl(auVar189,auVar41,2);
          bVar95 = (byte)uVar23 | ~bVar95;
          bVar88 = (byte)uVar24 & bVar88 & (byte)uVar25;
          auVar190._8_4_ = 2;
          auVar190._0_8_ = 0x200000002;
          auVar190._12_4_ = 2;
          auVar190._16_4_ = 2;
          auVar190._20_4_ = 2;
          auVar190._24_4_ = 2;
          auVar190._28_4_ = 2;
          auVar42._8_4_ = 3;
          auVar42._0_8_ = 0x300000003;
          auVar42._12_4_ = 3;
          auVar42._16_4_ = 3;
          auVar42._20_4_ = 3;
          auVar42._24_4_ = 3;
          auVar42._28_4_ = 3;
          auVar115 = vpblendmd_avx512vl(auVar190,auVar42);
          local_880._0_4_ = (uint)(bVar95 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar95 & 1) * 2;
          bVar7 = (bool)(bVar95 >> 1 & 1);
          local_880._4_4_ = (uint)bVar7 * auVar115._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar95 >> 2 & 1);
          fStack_878 = (float)((uint)bVar7 * auVar115._8_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar95 >> 3 & 1);
          fStack_874 = (float)((uint)bVar7 * auVar115._12_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar95 >> 4 & 1);
          fStack_870 = (float)((uint)bVar7 * auVar115._16_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar95 >> 5 & 1);
          fStack_86c = (float)((uint)bVar7 * auVar115._20_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar95 >> 6 & 1);
          fStack_868 = (float)((uint)bVar7 * auVar115._24_4_ | (uint)!bVar7 * 2);
          fStack_864 = (float)((uint)(bVar95 >> 7) * auVar115._28_4_ |
                              (uint)!(bool)(bVar95 >> 7) * 2);
          auVar193._0_32_ = _local_880;
          uVar23 = vpcmpd_avx512vl(_local_880,local_800,2);
          bVar95 = (byte)uVar23 & bVar88;
          if (bVar95 != 0) {
            auVar105 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar104 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar101 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar106 = vminps_avx(auVar105,auVar101);
            auVar105 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar101 = vmaxps_avx(auVar104,auVar105);
            auVar104 = vandps_avx(auVar267,auVar106);
            auVar105 = vandps_avx(auVar267,auVar101);
            auVar104 = vmaxps_avx(auVar104,auVar105);
            auVar105 = vmovshdup_avx(auVar104);
            auVar105 = vmaxss_avx(auVar105,auVar104);
            auVar104 = vshufpd_avx(auVar104,auVar104,1);
            auVar104 = vmaxss_avx(auVar104,auVar105);
            fVar172 = auVar104._0_4_ * 1.9073486e-06;
            local_a10 = vshufps_avx(auVar101,auVar101,0xff);
            _local_920 = _local_7c0;
            local_860 = (float)local_7c0._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_7c0._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_7b8 + fStack_8f8;
            fStack_854 = fStack_7b4 + fStack_8f4;
            fStack_850 = fStack_7b0 + fStack_8f0;
            fStack_84c = fStack_7ac + fStack_8ec;
            fStack_848 = fStack_7a8 + fStack_8e8;
            fStack_844 = fStack_7a4 + fStack_8e4;
            do {
              auVar191._8_4_ = 0x7f800000;
              auVar191._0_8_ = 0x7f8000007f800000;
              auVar191._12_4_ = 0x7f800000;
              auVar191._16_4_ = 0x7f800000;
              auVar191._20_4_ = 0x7f800000;
              auVar191._24_4_ = 0x7f800000;
              auVar191._28_4_ = 0x7f800000;
              auVar115 = vblendmps_avx512vl(auVar191,_local_920);
              auVar153._0_4_ =
                   (uint)(bVar95 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar95 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 1 & 1);
              auVar153._4_4_ = (uint)bVar7 * auVar115._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 2 & 1);
              auVar153._8_4_ = (uint)bVar7 * auVar115._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 3 & 1);
              auVar153._12_4_ = (uint)bVar7 * auVar115._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 4 & 1);
              auVar153._16_4_ = (uint)bVar7 * auVar115._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar95 >> 5 & 1);
              auVar153._20_4_ = (uint)bVar7 * auVar115._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar153._24_4_ =
                   (uint)(bVar95 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar95 >> 6) * 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar193._0_32_ = auVar153;
              auVar115 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar115 = vminps_avx(auVar153,auVar115);
              auVar118 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar118);
              auVar118 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar118);
              uVar23 = vcmpps_avx512vl(auVar153,auVar115,0);
              bVar90 = (byte)uVar23 & bVar95;
              bVar94 = bVar95;
              if (bVar90 != 0) {
                bVar94 = bVar90;
              }
              iVar26 = 0;
              for (uVar93 = (uint)bVar94; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                iVar26 = iVar26 + 1;
              }
              fVar256 = *(float *)(local_840 + (uint)(iVar26 << 2));
              fVar257 = *(float *)(local_7a0 + (uint)(iVar26 << 2));
              fVar259 = auVar103._0_4_;
              if ((float)local_a30._0_4_ < 0.0) {
                fVar259 = sqrtf((float)local_a30._0_4_);
              }
              lVar98 = 4;
              do {
                auVar177._4_4_ = fVar257;
                auVar177._0_4_ = fVar257;
                auVar177._8_4_ = fVar257;
                auVar177._12_4_ = fVar257;
                auVar105 = vfmadd132ps_fma(auVar177,ZEXT816(0) << 0x40,local_a20);
                fVar266 = 1.0 - fVar256;
                auVar225._0_4_ = local_980._0_4_ * fVar256;
                auVar225._4_4_ = local_980._4_4_ * fVar256;
                auVar225._8_4_ = local_980._8_4_ * fVar256;
                auVar225._12_4_ = local_980._12_4_ * fVar256;
                local_9b0 = ZEXT416((uint)fVar266);
                auVar240._4_4_ = fVar266;
                auVar240._0_4_ = fVar266;
                auVar240._8_4_ = fVar266;
                auVar240._12_4_ = fVar266;
                auVar104 = vfmadd231ps_fma(auVar225,auVar240,local_940._0_16_);
                auVar246._0_4_ = local_960._0_4_ * fVar256;
                auVar246._4_4_ = local_960._4_4_ * fVar256;
                auVar246._8_4_ = local_960._8_4_ * fVar256;
                auVar246._12_4_ = local_960._12_4_ * fVar256;
                auVar101 = vfmadd231ps_fma(auVar246,auVar240,local_980._0_16_);
                auVar251._0_4_ = fVar256 * (float)local_9a0._0_4_;
                auVar251._4_4_ = fVar256 * (float)local_9a0._4_4_;
                auVar251._8_4_ = fVar256 * fStack_998;
                auVar251._12_4_ = fVar256 * fStack_994;
                auVar106 = vfmadd231ps_fma(auVar251,auVar240,local_960._0_16_);
                auVar254._0_4_ = fVar256 * auVar101._0_4_;
                auVar254._4_4_ = fVar256 * auVar101._4_4_;
                auVar254._8_4_ = fVar256 * auVar101._8_4_;
                auVar254._12_4_ = fVar256 * auVar101._12_4_;
                auVar104 = vfmadd231ps_fma(auVar254,auVar240,auVar104);
                auVar226._0_4_ = fVar256 * auVar106._0_4_;
                auVar226._4_4_ = fVar256 * auVar106._4_4_;
                auVar226._8_4_ = fVar256 * auVar106._8_4_;
                auVar226._12_4_ = fVar256 * auVar106._12_4_;
                auVar101 = vfmadd231ps_fma(auVar226,auVar240,auVar101);
                auVar247._0_4_ = fVar256 * auVar101._0_4_;
                auVar247._4_4_ = fVar256 * auVar101._4_4_;
                auVar247._8_4_ = fVar256 * auVar101._8_4_;
                auVar247._12_4_ = fVar256 * auVar101._12_4_;
                auVar106 = vfmadd231ps_fma(auVar247,auVar104,auVar240);
                auVar104 = vsubps_avx(auVar101,auVar104);
                auVar30._8_4_ = 0x40400000;
                auVar30._0_8_ = 0x4040000040400000;
                auVar30._12_4_ = 0x40400000;
                auVar115 = auVar193._32_32_;
                auVar101 = vmulps_avx512vl(auVar104,auVar30);
                local_8e0._0_16_ = auVar106;
                auVar104 = vsubps_avx(auVar105,auVar106);
                local_a60._0_16_ = auVar104;
                auVar104 = vdpps_avx(auVar104,auVar104,0x7f);
                local_a80._0_16_ = auVar104;
                local_bc0 = ZEXT416((uint)fVar256);
                if (auVar104._0_4_ < 0.0) {
                  auVar194._0_4_ = sqrtf(auVar104._0_4_);
                  auVar194._4_60_ = extraout_var_01;
                  auVar104 = auVar194._0_16_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                }
                local_9c0 = vdpps_avx(auVar101,auVar101,0x7f);
                fVar266 = local_9c0._0_4_;
                auVar227._4_12_ = ZEXT812(0) << 0x20;
                auVar227._0_4_ = fVar266;
                auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar227);
                fVar196 = auVar105._0_4_;
                local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar227);
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar106 = vxorps_avx512vl(local_9c0,auVar31);
                auVar105 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
                uVar93 = auVar104._0_4_;
                if (fVar266 < auVar106._0_4_) {
                  auVar195._0_4_ = sqrtf(fVar266);
                  auVar195._4_60_ = extraout_var_02;
                  auVar104 = ZEXT416(uVar93);
                  auVar106 = auVar195._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx512f(local_9c0,local_9c0);
                }
                fVar266 = fVar196 * 1.5 + fVar266 * -0.5 * fVar196 * fVar196 * fVar196;
                auVar178._0_4_ = auVar101._0_4_ * fVar266;
                auVar178._4_4_ = auVar101._4_4_ * fVar266;
                auVar178._8_4_ = auVar101._8_4_ * fVar266;
                auVar178._12_4_ = auVar101._12_4_ * fVar266;
                auVar1 = vdpps_avx(local_a60._0_16_,auVar178,0x7f);
                fVar236 = auVar104._0_4_;
                fVar196 = auVar1._0_4_;
                auVar179._0_4_ = fVar196 * fVar196;
                auVar179._4_4_ = auVar1._4_4_ * auVar1._4_4_;
                auVar179._8_4_ = auVar1._8_4_ * auVar1._8_4_;
                auVar179._12_4_ = auVar1._12_4_ * auVar1._12_4_;
                auVar107 = vsubps_avx512vl(local_a80._0_16_,auVar179);
                fVar261 = auVar107._0_4_;
                auVar204._4_12_ = ZEXT812(0) << 0x20;
                auVar204._0_4_ = fVar261;
                auVar102 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
                auVar108 = vmulss_avx512f(auVar102,ZEXT416(0x3fc00000));
                auVar109 = vmulss_avx512f(auVar107,ZEXT416(0xbf000000));
                if (fVar261 < 0.0) {
                  local_9f0 = fVar266;
                  fStack_9ec = fVar266;
                  fStack_9e8 = fVar266;
                  fStack_9e4 = fVar266;
                  local_9e0 = auVar102;
                  fVar261 = sqrtf(fVar261);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar108 = ZEXT416(auVar108._0_4_);
                  auVar106 = ZEXT416(auVar106._0_4_);
                  auVar104 = ZEXT416(uVar93);
                  auVar102 = local_9e0;
                  fVar266 = local_9f0;
                  fVar262 = fStack_9ec;
                  fVar258 = fStack_9e8;
                  fVar260 = fStack_9e4;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  fVar261 = auVar107._0_4_;
                  fVar262 = fVar266;
                  fVar258 = fVar266;
                  fVar260 = fVar266;
                }
                auVar265._8_4_ = 0x7fffffff;
                auVar265._0_8_ = 0x7fffffff7fffffff;
                auVar265._12_4_ = 0x7fffffff;
                auVar162._32_32_ = auVar115;
                auVar162._0_32_ = local_aa0;
                auVar272 = ZEXT3264(local_aa0);
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9b0);
                fVar197 = auVar107._0_4_ * 6.0;
                fVar22 = fVar256 * 6.0;
                auVar228._0_4_ = fVar22 * (float)local_9a0._0_4_;
                auVar228._4_4_ = fVar22 * (float)local_9a0._4_4_;
                auVar228._8_4_ = fVar22 * fStack_998;
                auVar228._12_4_ = fVar22 * fStack_994;
                auVar205._4_4_ = fVar197;
                auVar205._0_4_ = fVar197;
                auVar205._8_4_ = fVar197;
                auVar205._12_4_ = fVar197;
                auVar107 = vfmadd132ps_fma(auVar205,auVar228,local_960._0_16_);
                auVar111 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9b0,local_bc0);
                fVar197 = auVar111._0_4_ * 6.0;
                auVar229._4_4_ = fVar197;
                auVar229._0_4_ = fVar197;
                auVar229._8_4_ = fVar197;
                auVar229._12_4_ = fVar197;
                auVar107 = vfmadd132ps_fma(auVar229,auVar107,local_980._0_16_);
                fVar197 = local_9b0._0_4_ * 6.0;
                auVar206._4_4_ = fVar197;
                auVar206._0_4_ = fVar197;
                auVar206._8_4_ = fVar197;
                auVar206._12_4_ = fVar197;
                auVar107 = vfmadd132ps_fma(auVar206,auVar107,local_940._0_16_);
                auVar230._0_4_ = auVar107._0_4_ * (float)local_9c0._0_4_;
                auVar230._4_4_ = auVar107._4_4_ * (float)local_9c0._0_4_;
                auVar230._8_4_ = auVar107._8_4_ * (float)local_9c0._0_4_;
                auVar230._12_4_ = auVar107._12_4_ * (float)local_9c0._0_4_;
                auVar107 = vdpps_avx(auVar101,auVar107,0x7f);
                fVar197 = auVar107._0_4_;
                auVar207._0_4_ = auVar101._0_4_ * fVar197;
                auVar207._4_4_ = auVar101._4_4_ * fVar197;
                auVar207._8_4_ = auVar101._8_4_ * fVar197;
                auVar207._12_4_ = auVar101._12_4_ * fVar197;
                auVar107 = vsubps_avx(auVar230,auVar207);
                fVar197 = auVar105._0_4_ * (float)local_9d0._0_4_;
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar193._16_48_ = auVar162._16_48_;
                auVar110 = vxorps_avx512vl(auVar101,auVar32);
                auVar248._0_4_ = fVar266 * auVar107._0_4_ * fVar197;
                auVar248._4_4_ = fVar262 * auVar107._4_4_ * fVar197;
                auVar248._8_4_ = fVar258 * auVar107._8_4_ * fVar197;
                auVar248._12_4_ = fVar260 * auVar107._12_4_ * fVar197;
                auVar105 = vdpps_avx(auVar110,auVar178,0x7f);
                auVar107 = vmaxss_avx(ZEXT416((uint)fVar172),
                                      ZEXT416((uint)(fVar257 * fVar259 * 1.9073486e-06)));
                auVar111 = vdivss_avx512f(ZEXT416((uint)fVar172),auVar106);
                auVar106 = vdpps_avx(local_a60._0_16_,auVar248,0x7f);
                auVar104 = vfmadd213ss_fma(auVar104,ZEXT416((uint)fVar172),auVar107);
                auVar111 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 + 1.0)),auVar111,auVar104);
                auVar104 = vdpps_avx(local_a20,auVar178,0x7f);
                fVar266 = auVar105._0_4_ + auVar106._0_4_;
                auVar105 = vdpps_avx(local_a60._0_16_,auVar110,0x7f);
                auVar109 = vmulss_avx512f(auVar109,auVar102);
                auVar102 = vmulss_avx512f(auVar102,auVar102);
                auVar106 = vdpps_avx(local_a60._0_16_,local_a20,0x7f);
                auVar193._0_16_ =
                     vaddss_avx512f(auVar108,ZEXT416((uint)(auVar109._0_4_ * auVar102._0_4_)));
                auVar102 = vfnmadd231ss_fma(auVar105,auVar1,ZEXT416((uint)fVar266));
                auVar108 = vfnmadd231ss_fma(auVar106,auVar1,auVar104);
                auVar105 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar261 = fVar261 - auVar105._0_4_;
                auVar105 = vshufps_avx(auVar101,auVar101,0xff);
                auVar106 = vfmsub213ss_fma(auVar102,auVar193._0_16_,auVar105);
                fVar236 = auVar108._0_4_ * auVar193._0_4_;
                auVar102 = vfmsub231ss_fma(ZEXT416((uint)(auVar104._0_4_ * auVar106._0_4_)),
                                           ZEXT416((uint)fVar266),ZEXT416((uint)fVar236));
                fVar262 = auVar102._0_4_;
                fVar266 = fVar261 * (fVar266 / fVar262) - fVar196 * (auVar106._0_4_ / fVar262);
                auVar249 = ZEXT464((uint)fVar266);
                fVar256 = fVar256 - (fVar196 * (fVar236 / fVar262) -
                                    fVar261 * (auVar104._0_4_ / fVar262));
                fVar257 = fVar257 - fVar266;
                auVar104 = vandps_avx(auVar1,auVar265);
                if (auVar111._0_4_ <= auVar104._0_4_) {
LAB_01deefa9:
                  bVar7 = false;
                }
                else {
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(auVar111._0_4_ + auVar107._0_4_)),
                                             local_a10,ZEXT416(0x36000000));
                  auVar104 = vandps_avx(auVar265,ZEXT416((uint)fVar261));
                  if (auVar106._0_4_ <= auVar104._0_4_) goto LAB_01deefa9;
                  fVar257 = fVar257 + (float)local_a00._0_4_;
                  bVar7 = true;
                  if (fVar237 <= fVar257) {
                    fVar266 = *(float *)(ray + k * 4 + 0x200);
                    auVar249 = ZEXT464((uint)fVar266);
                    if (((fVar257 <= fVar266) && (0.0 <= fVar256)) && (fVar256 <= 1.0)) {
                      auVar164._16_48_ = auVar193._16_48_;
                      auVar164._0_16_ = ZEXT816(0) << 0x20;
                      auVar163._4_60_ = auVar164._4_60_;
                      auVar163._0_4_ = local_a80._0_4_;
                      auVar104 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar163._0_16_);
                      fVar196 = auVar104._0_4_;
                      auVar193._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[uVar97].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        fVar196 = fVar196 * 1.5 + auVar193._0_4_ * fVar196 * fVar196 * fVar196;
                        auVar208._0_4_ = local_a60._0_4_ * fVar196;
                        auVar208._4_4_ = local_a60._4_4_ * fVar196;
                        auVar208._8_4_ = local_a60._8_4_ * fVar196;
                        auVar208._12_4_ = local_a60._12_4_ * fVar196;
                        auVar106 = vfmadd213ps_fma(auVar105,auVar208,auVar101);
                        auVar104 = vshufps_avx(auVar208,auVar208,0xc9);
                        auVar105 = vshufps_avx(auVar101,auVar101,0xc9);
                        auVar209._0_4_ = auVar208._0_4_ * auVar105._0_4_;
                        auVar209._4_4_ = auVar208._4_4_ * auVar105._4_4_;
                        auVar209._8_4_ = auVar208._8_4_ * auVar105._8_4_;
                        auVar209._12_4_ = auVar208._12_4_ * auVar105._12_4_;
                        auVar101 = vfmsub231ps_fma(auVar209,auVar101,auVar104);
                        auVar104 = vshufps_avx(auVar101,auVar101,0xc9);
                        auVar105 = vshufps_avx(auVar106,auVar106,0xc9);
                        auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                        auVar180._0_4_ = auVar106._0_4_ * auVar101._0_4_;
                        auVar180._4_4_ = auVar106._4_4_ * auVar101._4_4_;
                        auVar180._8_4_ = auVar106._8_4_ * auVar101._8_4_;
                        auVar180._12_4_ = auVar106._12_4_ * auVar101._12_4_;
                        auVar104 = vfmsub231ps_fma(auVar180,auVar104,auVar105);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x200) = fVar257;
                          uVar238 = vextractps_avx(auVar104,1);
                          *(undefined4 *)(ray + k * 4 + 0x300) = uVar238;
                          uVar238 = vextractps_avx(auVar104,2);
                          *(undefined4 *)(ray + k * 4 + 0x340) = uVar238;
                          *(int *)(ray + k * 4 + 0x380) = auVar104._0_4_;
                          *(float *)(ray + k * 4 + 0x3c0) = fVar256;
                          *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                          *(uint *)(ray + k * 4 + 0x440) = uVar3;
                          *(uint *)(ray + k * 4 + 0x480) = uVar97;
                          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar6 = context->user;
                          local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar256));
                          auVar193 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar193 = vpermps_avx512f(auVar193,ZEXT1664(auVar104));
                          auVar156 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar156,ZEXT1664(auVar104));
                          local_380 = vbroadcastss_avx512f(auVar104);
                          local_400[0] = (RTCHitN)auVar193[0];
                          local_400[1] = (RTCHitN)auVar193[1];
                          local_400[2] = (RTCHitN)auVar193[2];
                          local_400[3] = (RTCHitN)auVar193[3];
                          local_400[4] = (RTCHitN)auVar193[4];
                          local_400[5] = (RTCHitN)auVar193[5];
                          local_400[6] = (RTCHitN)auVar193[6];
                          local_400[7] = (RTCHitN)auVar193[7];
                          local_400[8] = (RTCHitN)auVar193[8];
                          local_400[9] = (RTCHitN)auVar193[9];
                          local_400[10] = (RTCHitN)auVar193[10];
                          local_400[0xb] = (RTCHitN)auVar193[0xb];
                          local_400[0xc] = (RTCHitN)auVar193[0xc];
                          local_400[0xd] = (RTCHitN)auVar193[0xd];
                          local_400[0xe] = (RTCHitN)auVar193[0xe];
                          local_400[0xf] = (RTCHitN)auVar193[0xf];
                          local_400[0x10] = (RTCHitN)auVar193[0x10];
                          local_400[0x11] = (RTCHitN)auVar193[0x11];
                          local_400[0x12] = (RTCHitN)auVar193[0x12];
                          local_400[0x13] = (RTCHitN)auVar193[0x13];
                          local_400[0x14] = (RTCHitN)auVar193[0x14];
                          local_400[0x15] = (RTCHitN)auVar193[0x15];
                          local_400[0x16] = (RTCHitN)auVar193[0x16];
                          local_400[0x17] = (RTCHitN)auVar193[0x17];
                          local_400[0x18] = (RTCHitN)auVar193[0x18];
                          local_400[0x19] = (RTCHitN)auVar193[0x19];
                          local_400[0x1a] = (RTCHitN)auVar193[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar193[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar193[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar193[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar193[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar193[0x1f];
                          local_400[0x20] = (RTCHitN)auVar193[0x20];
                          local_400[0x21] = (RTCHitN)auVar193[0x21];
                          local_400[0x22] = (RTCHitN)auVar193[0x22];
                          local_400[0x23] = (RTCHitN)auVar193[0x23];
                          local_400[0x24] = (RTCHitN)auVar193[0x24];
                          local_400[0x25] = (RTCHitN)auVar193[0x25];
                          local_400[0x26] = (RTCHitN)auVar193[0x26];
                          local_400[0x27] = (RTCHitN)auVar193[0x27];
                          local_400[0x28] = (RTCHitN)auVar193[0x28];
                          local_400[0x29] = (RTCHitN)auVar193[0x29];
                          local_400[0x2a] = (RTCHitN)auVar193[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar193[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar193[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar193[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar193[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar193[0x2f];
                          local_400[0x30] = (RTCHitN)auVar193[0x30];
                          local_400[0x31] = (RTCHitN)auVar193[0x31];
                          local_400[0x32] = (RTCHitN)auVar193[0x32];
                          local_400[0x33] = (RTCHitN)auVar193[0x33];
                          local_400[0x34] = (RTCHitN)auVar193[0x34];
                          local_400[0x35] = (RTCHitN)auVar193[0x35];
                          local_400[0x36] = (RTCHitN)auVar193[0x36];
                          local_400[0x37] = (RTCHitN)auVar193[0x37];
                          local_400[0x38] = (RTCHitN)auVar193[0x38];
                          local_400[0x39] = (RTCHitN)auVar193[0x39];
                          local_400[0x3a] = (RTCHitN)auVar193[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar193[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar193[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar193[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar193[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar193[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_480._0_8_;
                          uStack_2b8 = local_480._8_8_;
                          uStack_2b0 = local_480._16_8_;
                          uStack_2a8 = local_480._24_8_;
                          uStack_2a0 = local_480._32_8_;
                          uStack_298 = local_480._40_8_;
                          uStack_290 = local_480._48_8_;
                          uStack_288 = local_480._56_8_;
                          auVar193 = vmovdqa64_avx512f(local_440);
                          local_280 = vmovdqa64_avx512f(auVar193);
                          auVar115 = vpcmpeqd_avx2(auVar193._0_32_,auVar193._0_32_);
                          local_ac8[3] = auVar115;
                          local_ac8[2] = auVar115;
                          local_ac8[1] = auVar115;
                          *local_ac8 = auVar115;
                          local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar257;
                          local_8c0 = local_4c0;
                          local_b10.valid = (int *)local_8c0;
                          local_b10.geometryUserPtr = pGVar4->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->intersectionFilterN)(&local_b10);
                            auVar272 = ZEXT3264(local_aa0);
                          }
                          auVar193 = vmovdqa64_avx512f(local_8c0);
                          uVar23 = vptestmd_avx512f(auVar193,auVar193);
                          if ((short)uVar23 == 0) {
LAB_01def276:
                            *(float *)(ray + k * 4 + 0x200) = fVar266;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&local_b10);
                              auVar272 = ZEXT3264(local_aa0);
                            }
                            auVar193 = vmovdqa64_avx512f(local_8c0);
                            uVar100 = vptestmd_avx512f(auVar193,auVar193);
                            if ((short)uVar100 == 0) goto LAB_01def276;
                            iVar67 = *(int *)(local_b10.hit + 4);
                            iVar68 = *(int *)(local_b10.hit + 8);
                            iVar69 = *(int *)(local_b10.hit + 0xc);
                            iVar70 = *(int *)(local_b10.hit + 0x10);
                            iVar71 = *(int *)(local_b10.hit + 0x14);
                            iVar72 = *(int *)(local_b10.hit + 0x18);
                            iVar73 = *(int *)(local_b10.hit + 0x1c);
                            iVar74 = *(int *)(local_b10.hit + 0x20);
                            iVar75 = *(int *)(local_b10.hit + 0x24);
                            iVar76 = *(int *)(local_b10.hit + 0x28);
                            iVar77 = *(int *)(local_b10.hit + 0x2c);
                            iVar78 = *(int *)(local_b10.hit + 0x30);
                            iVar79 = *(int *)(local_b10.hit + 0x34);
                            iVar80 = *(int *)(local_b10.hit + 0x38);
                            iVar81 = *(int *)(local_b10.hit + 0x3c);
                            bVar94 = (byte)uVar100;
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar90 = (byte)(uVar100 >> 8);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar94 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar94 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x33c);
                            iVar67 = *(int *)(local_b10.hit + 0x44);
                            iVar68 = *(int *)(local_b10.hit + 0x48);
                            iVar69 = *(int *)(local_b10.hit + 0x4c);
                            iVar70 = *(int *)(local_b10.hit + 0x50);
                            iVar71 = *(int *)(local_b10.hit + 0x54);
                            iVar72 = *(int *)(local_b10.hit + 0x58);
                            iVar73 = *(int *)(local_b10.hit + 0x5c);
                            iVar74 = *(int *)(local_b10.hit + 0x60);
                            iVar75 = *(int *)(local_b10.hit + 100);
                            iVar76 = *(int *)(local_b10.hit + 0x68);
                            iVar77 = *(int *)(local_b10.hit + 0x6c);
                            iVar78 = *(int *)(local_b10.hit + 0x70);
                            iVar79 = *(int *)(local_b10.hit + 0x74);
                            iVar80 = *(int *)(local_b10.hit + 0x78);
                            iVar81 = *(int *)(local_b10.hit + 0x7c);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar94 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar94 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x37c);
                            iVar67 = *(int *)(local_b10.hit + 0x84);
                            iVar68 = *(int *)(local_b10.hit + 0x88);
                            iVar69 = *(int *)(local_b10.hit + 0x8c);
                            iVar70 = *(int *)(local_b10.hit + 0x90);
                            iVar71 = *(int *)(local_b10.hit + 0x94);
                            iVar72 = *(int *)(local_b10.hit + 0x98);
                            iVar73 = *(int *)(local_b10.hit + 0x9c);
                            iVar74 = *(int *)(local_b10.hit + 0xa0);
                            iVar75 = *(int *)(local_b10.hit + 0xa4);
                            iVar76 = *(int *)(local_b10.hit + 0xa8);
                            iVar77 = *(int *)(local_b10.hit + 0xac);
                            iVar78 = *(int *)(local_b10.hit + 0xb0);
                            iVar79 = *(int *)(local_b10.hit + 0xb4);
                            iVar80 = *(int *)(local_b10.hit + 0xb8);
                            iVar81 = *(int *)(local_b10.hit + 0xbc);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar94 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar94 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3bc);
                            iVar67 = *(int *)(local_b10.hit + 0xc4);
                            iVar68 = *(int *)(local_b10.hit + 200);
                            iVar69 = *(int *)(local_b10.hit + 0xcc);
                            iVar70 = *(int *)(local_b10.hit + 0xd0);
                            iVar71 = *(int *)(local_b10.hit + 0xd4);
                            iVar72 = *(int *)(local_b10.hit + 0xd8);
                            iVar73 = *(int *)(local_b10.hit + 0xdc);
                            iVar74 = *(int *)(local_b10.hit + 0xe0);
                            iVar75 = *(int *)(local_b10.hit + 0xe4);
                            iVar76 = *(int *)(local_b10.hit + 0xe8);
                            iVar77 = *(int *)(local_b10.hit + 0xec);
                            iVar78 = *(int *)(local_b10.hit + 0xf0);
                            iVar79 = *(int *)(local_b10.hit + 0xf4);
                            iVar80 = *(int *)(local_b10.hit + 0xf8);
                            iVar81 = *(int *)(local_b10.hit + 0xfc);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar94 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar94 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x3fc);
                            iVar67 = *(int *)(local_b10.hit + 0x104);
                            iVar68 = *(int *)(local_b10.hit + 0x108);
                            iVar69 = *(int *)(local_b10.hit + 0x10c);
                            iVar70 = *(int *)(local_b10.hit + 0x110);
                            iVar71 = *(int *)(local_b10.hit + 0x114);
                            iVar72 = *(int *)(local_b10.hit + 0x118);
                            iVar73 = *(int *)(local_b10.hit + 0x11c);
                            iVar74 = *(int *)(local_b10.hit + 0x120);
                            iVar75 = *(int *)(local_b10.hit + 0x124);
                            iVar76 = *(int *)(local_b10.hit + 0x128);
                            iVar77 = *(int *)(local_b10.hit + 300);
                            iVar78 = *(int *)(local_b10.hit + 0x130);
                            iVar79 = *(int *)(local_b10.hit + 0x134);
                            iVar80 = *(int *)(local_b10.hit + 0x138);
                            iVar81 = *(int *)(local_b10.hit + 0x13c);
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar100 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar100 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar100 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar100 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar100 >> 6) & 1);
                            bVar13 = (bool)((byte)(uVar100 >> 7) & 1);
                            bVar14 = (bool)((byte)(uVar100 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar100 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            bVar20 = SUB81(uVar100 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar94 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar94 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar99 * iVar67 |
                                 (uint)!bVar99 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar12 * iVar72 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar13 * iVar73 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar90 & 1) * iVar74 |
                                 (uint)!(bool)(bVar90 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar19 * iVar80 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar20 * iVar81 |
                                 (uint)!bVar20 * *(int *)(local_b10.ray + 0x43c);
                            auVar193 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar193 = vmovdqu32_avx512f(auVar193);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar193;
                            auVar193 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar193 = vmovdqu32_avx512f(auVar193);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar193;
                            auVar156 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar193 = vmovdqa32_avx512f(auVar156);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar193;
                            auVar235 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar99 = (bool)((byte)(uVar100 >> 1) & 1);
                            auVar65._4_56_ = auVar235._8_56_;
                            auVar65._0_4_ =
                                 (uint)bVar99 * auVar235._4_4_ | (uint)!bVar99 * auVar156._4_4_;
                            auVar193._0_8_ = auVar65._0_8_ << 0x20;
                            bVar99 = (bool)((byte)(uVar100 >> 2) & 1);
                            auVar193._8_4_ =
                                 (uint)bVar99 * auVar235._8_4_ | (uint)!bVar99 * auVar156._8_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 3) & 1);
                            auVar193._12_4_ =
                                 (uint)bVar99 * auVar235._12_4_ | (uint)!bVar99 * auVar156._12_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 4) & 1);
                            auVar193._16_4_ =
                                 (uint)bVar99 * auVar235._16_4_ | (uint)!bVar99 * auVar156._16_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 5) & 1);
                            auVar193._20_4_ =
                                 (uint)bVar99 * auVar235._20_4_ | (uint)!bVar99 * auVar156._20_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 6) & 1);
                            auVar193._24_4_ =
                                 (uint)bVar99 * auVar235._24_4_ | (uint)!bVar99 * auVar156._24_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 7) & 1);
                            auVar193._28_4_ =
                                 (uint)bVar99 * auVar235._28_4_ | (uint)!bVar99 * auVar156._28_4_;
                            auVar193._32_4_ =
                                 (uint)(bVar90 & 1) * auVar235._32_4_ |
                                 (uint)!(bool)(bVar90 & 1) * auVar156._32_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 9) & 1);
                            auVar193._36_4_ =
                                 (uint)bVar99 * auVar235._36_4_ | (uint)!bVar99 * auVar156._36_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 10) & 1);
                            auVar193._40_4_ =
                                 (uint)bVar99 * auVar235._40_4_ | (uint)!bVar99 * auVar156._40_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xb) & 1);
                            auVar193._44_4_ =
                                 (uint)bVar99 * auVar235._44_4_ | (uint)!bVar99 * auVar156._44_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xc) & 1);
                            auVar193._48_4_ =
                                 (uint)bVar99 * auVar235._48_4_ | (uint)!bVar99 * auVar156._48_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xd) & 1);
                            auVar193._52_4_ =
                                 (uint)bVar99 * auVar235._52_4_ | (uint)!bVar99 * auVar156._52_4_;
                            bVar99 = (bool)((byte)(uVar100 >> 0xe) & 1);
                            auVar193._56_4_ =
                                 (uint)bVar99 * auVar235._56_4_ | (uint)!bVar99 * auVar156._56_4_;
                            bVar99 = SUB81(uVar100 >> 0xf,0);
                            auVar193._60_4_ =
                                 (uint)bVar99 * auVar235._60_4_ | (uint)!bVar99 * auVar156._60_4_;
                            auVar156 = vmovdqa32_avx512f(auVar235);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar156;
                          }
                          auVar249 = ZEXT464((uint)fVar266);
                        }
                      }
                    }
                  }
                }
                bVar99 = lVar98 != 0;
                lVar98 = lVar98 + -1;
              } while ((!bVar7) && (bVar99));
              auVar83._4_4_ = fStack_85c;
              auVar83._0_4_ = local_860;
              auVar83._8_4_ = fStack_858;
              auVar83._12_4_ = fStack_854;
              auVar83._16_4_ = fStack_850;
              auVar83._20_4_ = fStack_84c;
              auVar83._24_4_ = fStack_848;
              auVar83._28_4_ = fStack_844;
              uVar238 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar43._4_4_ = uVar238;
              auVar43._0_4_ = uVar238;
              auVar43._8_4_ = uVar238;
              auVar43._12_4_ = uVar238;
              auVar43._16_4_ = uVar238;
              auVar43._20_4_ = uVar238;
              auVar43._24_4_ = uVar238;
              auVar43._28_4_ = uVar238;
              uVar23 = vcmpps_avx512vl(auVar83,auVar43,2);
              bVar95 = ~('\x01' << ((byte)iVar26 & 0x1f)) & bVar95 & (byte)uVar23;
            } while (bVar95 != 0);
          }
          uVar25 = vpcmpd_avx512vl(local_800,_local_880,1);
          uVar24 = vpcmpd_avx512vl(local_800,local_780,1);
          auVar214._0_4_ = (float)local_900._0_4_ + (float)local_500._0_4_;
          auVar214._4_4_ = (float)local_900._4_4_ + (float)local_500._4_4_;
          auVar214._8_4_ = fStack_8f8 + fStack_4f8;
          auVar214._12_4_ = fStack_8f4 + fStack_4f4;
          auVar214._16_4_ = fStack_8f0 + fStack_4f0;
          auVar214._20_4_ = fStack_8ec + fStack_4ec;
          auVar214._24_4_ = fStack_8e8 + fStack_4e8;
          auVar214._28_4_ = fStack_8e4 + fStack_4e4;
          uVar238 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar234._4_4_ = uVar238;
          auVar234._0_4_ = uVar238;
          auVar234._8_4_ = uVar238;
          auVar234._12_4_ = uVar238;
          auVar234._16_4_ = uVar238;
          auVar234._20_4_ = uVar238;
          auVar234._24_4_ = uVar238;
          auVar234._28_4_ = uVar238;
          uVar23 = vcmpps_avx512vl(auVar214,auVar234,2);
          bVar91 = bVar91 & (byte)uVar24 & (byte)uVar23;
          auVar241._0_4_ = (float)local_900._0_4_ + local_7c0._0_4_;
          auVar241._4_4_ = (float)local_900._4_4_ + local_7c0._4_4_;
          auVar241._8_4_ = fStack_8f8 + local_7c0._8_4_;
          auVar241._12_4_ = fStack_8f4 + local_7c0._12_4_;
          auVar241._16_4_ = fStack_8f0 + local_7c0._16_4_;
          auVar241._20_4_ = fStack_8ec + local_7c0._20_4_;
          auVar241._24_4_ = fStack_8e8 + local_7c0._24_4_;
          auVar241._28_4_ = fStack_8e4 + local_7c0._28_4_;
          uVar23 = vcmpps_avx512vl(auVar241,auVar234,2);
          bVar88 = bVar88 & (byte)uVar25 & (byte)uVar23 | bVar91;
          prim = local_ac0;
          if (bVar88 == 0) {
            auVar242 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar100 = local_ab0 & 0xffffffff;
            abStack_1a0[uVar100 * 0x60] = bVar88;
            auVar154._0_4_ =
                 (uint)(bVar91 & 1) * local_500._0_4_ |
                 (uint)!(bool)(bVar91 & 1) * (int)local_7c0._0_4_;
            bVar7 = (bool)(bVar91 >> 1 & 1);
            auVar154._4_4_ = (uint)bVar7 * local_500._4_4_ | (uint)!bVar7 * (int)local_7c0._4_4_;
            bVar7 = (bool)(bVar91 >> 2 & 1);
            auVar154._8_4_ = (uint)bVar7 * (int)fStack_4f8 | (uint)!bVar7 * (int)local_7c0._8_4_;
            bVar7 = (bool)(bVar91 >> 3 & 1);
            auVar154._12_4_ = (uint)bVar7 * (int)fStack_4f4 | (uint)!bVar7 * (int)local_7c0._12_4_;
            bVar7 = (bool)(bVar91 >> 4 & 1);
            auVar154._16_4_ = (uint)bVar7 * (int)fStack_4f0 | (uint)!bVar7 * (int)local_7c0._16_4_;
            bVar7 = (bool)(bVar91 >> 5 & 1);
            auVar154._20_4_ = (uint)bVar7 * (int)fStack_4ec | (uint)!bVar7 * (int)local_7c0._20_4_;
            auVar154._24_4_ =
                 (uint)(bVar91 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar91 >> 6) * (int)local_7c0._24_4_;
            auVar154._28_4_ = local_7c0._28_4_;
            auVar193._0_32_ = auVar154;
            *(undefined1 (*) [32])(auStack_180 + uVar100 * 0x60) = auVar154;
            uVar23 = vmovlps_avx(local_ae0);
            *(undefined8 *)(afStack_160 + uVar100 * 0x18) = uVar23;
            auStack_158[uVar100 * 0x18] = (int)local_ab8 + 1;
            local_ab0 = (ulong)((int)local_ab0 + 1);
            auVar242 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar235 = ZEXT1664(local_ae0);
    local_ab0 = local_ab0 & 0xffffffff;
    do {
      if ((int)local_ab0 == 0) {
        uVar238 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar45._4_4_ = uVar238;
        auVar45._0_4_ = uVar238;
        auVar45._8_4_ = uVar238;
        auVar45._12_4_ = uVar238;
        auVar45._16_4_ = uVar238;
        auVar45._20_4_ = uVar238;
        auVar45._24_4_ = uVar238;
        auVar45._28_4_ = uVar238;
        uVar23 = vcmpps_avx512vl(local_760,auVar45,2);
        uVar97 = (uint)local_aa8 & (uint)uVar23;
        local_aa8 = (ulong)uVar97;
        if (uVar97 == 0) {
          return;
        }
        goto LAB_01dece0d;
      }
      uVar100 = (ulong)((int)local_ab0 - 1);
      lVar98 = uVar100 * 0x60;
      auVar115 = *(undefined1 (*) [32])(auStack_180 + lVar98);
      auVar215._0_4_ = auVar115._0_4_ + (float)local_900._0_4_;
      auVar215._4_4_ = auVar115._4_4_ + (float)local_900._4_4_;
      auVar215._8_4_ = auVar115._8_4_ + fStack_8f8;
      auVar215._12_4_ = auVar115._12_4_ + fStack_8f4;
      auVar215._16_4_ = auVar115._16_4_ + fStack_8f0;
      auVar215._20_4_ = auVar115._20_4_ + fStack_8ec;
      auVar215._24_4_ = auVar115._24_4_ + fStack_8e8;
      auVar215._28_4_ = auVar115._28_4_ + fStack_8e4;
      uVar238 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar44._4_4_ = uVar238;
      auVar44._0_4_ = uVar238;
      auVar44._8_4_ = uVar238;
      auVar44._12_4_ = uVar238;
      auVar44._16_4_ = uVar238;
      auVar44._20_4_ = uVar238;
      auVar44._24_4_ = uVar238;
      auVar44._28_4_ = uVar238;
      uVar23 = vcmpps_avx512vl(auVar215,auVar44,2);
      uVar93 = (uint)uVar23 & (uint)abStack_1a0[lVar98];
      bVar88 = (byte)uVar93;
      if (uVar93 != 0) {
        auVar216._8_4_ = 0x7f800000;
        auVar216._0_8_ = 0x7f8000007f800000;
        auVar216._12_4_ = 0x7f800000;
        auVar216._16_4_ = 0x7f800000;
        auVar216._20_4_ = 0x7f800000;
        auVar216._24_4_ = 0x7f800000;
        auVar216._28_4_ = 0x7f800000;
        auVar118 = vblendmps_avx512vl(auVar216,auVar115);
        auVar155._0_4_ =
             (uint)(bVar88 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar88 & 1) * (int)auVar115._0_4_;
        bVar7 = (bool)((byte)(uVar93 >> 1) & 1);
        auVar155._4_4_ = (uint)bVar7 * auVar118._4_4_ | (uint)!bVar7 * (int)auVar115._4_4_;
        bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
        auVar155._8_4_ = (uint)bVar7 * auVar118._8_4_ | (uint)!bVar7 * (int)auVar115._8_4_;
        bVar7 = (bool)((byte)(uVar93 >> 3) & 1);
        auVar155._12_4_ = (uint)bVar7 * auVar118._12_4_ | (uint)!bVar7 * (int)auVar115._12_4_;
        bVar7 = (bool)((byte)(uVar93 >> 4) & 1);
        auVar155._16_4_ = (uint)bVar7 * auVar118._16_4_ | (uint)!bVar7 * (int)auVar115._16_4_;
        bVar7 = (bool)((byte)(uVar93 >> 5) & 1);
        auVar155._20_4_ = (uint)bVar7 * auVar118._20_4_ | (uint)!bVar7 * (int)auVar115._20_4_;
        bVar7 = (bool)((byte)(uVar93 >> 6) & 1);
        auVar155._24_4_ = (uint)bVar7 * auVar118._24_4_ | (uint)!bVar7 * (int)auVar115._24_4_;
        auVar155._28_4_ =
             (uVar93 >> 7) * auVar118._28_4_ | (uint)!SUB41(uVar93 >> 7,0) * (int)auVar115._28_4_;
        auVar193._0_32_ = auVar155;
        auVar115 = vshufps_avx(auVar155,auVar155,0xb1);
        auVar115 = vminps_avx(auVar155,auVar115);
        auVar118 = vshufpd_avx(auVar115,auVar115,5);
        auVar115 = vminps_avx(auVar115,auVar118);
        auVar118 = vpermpd_avx2(auVar115,0x4e);
        auVar115 = vminps_avx(auVar115,auVar118);
        uVar23 = vcmpps_avx512vl(auVar155,auVar115,0);
        bVar95 = (byte)uVar23 & bVar88;
        if (bVar95 != 0) {
          uVar93 = (uint)bVar95;
        }
        fVar172 = afStack_160[uVar100 * 0x18 + 1];
        uVar165 = 0;
        for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
          uVar165 = uVar165 + 1;
        }
        local_ab8 = (ulong)auStack_158[uVar100 * 0x18];
        bVar95 = ~('\x01' << ((byte)uVar165 & 0x1f)) & bVar88;
        abStack_1a0[lVar98] = bVar95;
        uVar96 = uVar100;
        if (bVar95 != 0) {
          uVar96 = local_ab0;
        }
        fVar256 = afStack_160[uVar100 * 0x18];
        auVar217._4_4_ = fVar256;
        auVar217._0_4_ = fVar256;
        auVar217._8_4_ = fVar256;
        auVar217._12_4_ = fVar256;
        auVar217._16_4_ = fVar256;
        auVar217._20_4_ = fVar256;
        auVar217._24_4_ = fVar256;
        auVar217._28_4_ = fVar256;
        fVar172 = fVar172 - fVar256;
        auVar192._4_4_ = fVar172;
        auVar192._0_4_ = fVar172;
        auVar192._8_4_ = fVar172;
        auVar192._12_4_ = fVar172;
        auVar192._16_4_ = fVar172;
        auVar192._20_4_ = fVar172;
        auVar192._24_4_ = fVar172;
        auVar192._28_4_ = fVar172;
        auVar104 = vfmadd132ps_fma(auVar192,auVar217,auVar242._0_32_);
        auVar115 = ZEXT1632(auVar104);
        local_400[0] = (RTCHitN)auVar115[0];
        local_400[1] = (RTCHitN)auVar115[1];
        local_400[2] = (RTCHitN)auVar115[2];
        local_400[3] = (RTCHitN)auVar115[3];
        local_400[4] = (RTCHitN)auVar115[4];
        local_400[5] = (RTCHitN)auVar115[5];
        local_400[6] = (RTCHitN)auVar115[6];
        local_400[7] = (RTCHitN)auVar115[7];
        local_400[8] = (RTCHitN)auVar115[8];
        local_400[9] = (RTCHitN)auVar115[9];
        local_400[10] = (RTCHitN)auVar115[10];
        local_400[0xb] = (RTCHitN)auVar115[0xb];
        local_400[0xc] = (RTCHitN)auVar115[0xc];
        local_400[0xd] = (RTCHitN)auVar115[0xd];
        local_400[0xe] = (RTCHitN)auVar115[0xe];
        local_400[0xf] = (RTCHitN)auVar115[0xf];
        local_400[0x10] = (RTCHitN)auVar115[0x10];
        local_400[0x11] = (RTCHitN)auVar115[0x11];
        local_400[0x12] = (RTCHitN)auVar115[0x12];
        local_400[0x13] = (RTCHitN)auVar115[0x13];
        local_400[0x14] = (RTCHitN)auVar115[0x14];
        local_400[0x15] = (RTCHitN)auVar115[0x15];
        local_400[0x16] = (RTCHitN)auVar115[0x16];
        local_400[0x17] = (RTCHitN)auVar115[0x17];
        local_400[0x18] = (RTCHitN)auVar115[0x18];
        local_400[0x19] = (RTCHitN)auVar115[0x19];
        local_400[0x1a] = (RTCHitN)auVar115[0x1a];
        local_400[0x1b] = (RTCHitN)auVar115[0x1b];
        local_400[0x1c] = (RTCHitN)auVar115[0x1c];
        local_400[0x1d] = (RTCHitN)auVar115[0x1d];
        local_400[0x1e] = (RTCHitN)auVar115[0x1e];
        local_400[0x1f] = (RTCHitN)auVar115[0x1f];
        auVar235 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar165 * 4));
        uVar100 = uVar96;
      }
      local_ab0 = uVar100;
    } while (bVar88 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }